

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O1

void ImGui::ShowDemoWindow(bool *p_open)

{
  char cVar1;
  ushort uVar2;
  double dVar3;
  ImVec2 IVar4;
  undefined4 uVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  ImU32 IVar10;
  int iVar11;
  ImGuiMouseCursor IVar12;
  ImGuiContext *pIVar13;
  void *pvVar14;
  ImGuiIO *pIVar15;
  ImDrawList *pIVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  int obj_i;
  int iVar20;
  bool *pbVar21;
  int i;
  void *ptr_id;
  long lVar22;
  char *pcVar23;
  char *pcVar24;
  int i_14;
  int i_3;
  int i_2;
  undefined8 *puVar25;
  MyDocument *doc;
  int doc_n;
  uint uVar26;
  long lVar27;
  undefined **ppuVar28;
  float fVar29;
  float fVar30;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  ImVec2 canvas_size;
  ImVec2 mouse_pos_in_canvas;
  char label [128];
  ImVec2 local_128;
  float local_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  ImVec2 local_f0;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  char *pcStack_d0;
  char *local_c8;
  char *pcStack_c0;
  char *local_b8;
  bool *local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  float local_48;
  float fStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pIVar13 = GetCurrentContext();
  if (pIVar13 == (ImGuiContext *)0x0) {
    __assert_fail("ImGui::GetCurrentContext() != __null && \"Missing dear imgui context. Refer to examples app!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui_demo.cpp"
                  ,0xc5,"void ImGui::ShowDemoWindow(bool *)");
  }
  if (ShowDemoWindow::show_app_documents == true) {
    if ((ShowExampleAppDocuments(bool*)::app == '\0') &&
       (iVar20 = __cxa_guard_acquire(&ShowExampleAppDocuments(bool*)::app), iVar20 != 0)) {
      ExampleAppDocuments::ExampleAppDocuments
                ((ExampleAppDocuments *)&ShowExampleAppDocuments(bool*)::app);
      __cxa_atexit(ExampleAppDocuments::~ExampleAppDocuments,&ShowExampleAppDocuments(bool*)::app,
                   &__dso_handle);
      __cxa_guard_release(&ShowExampleAppDocuments(bool*)::app);
    }
    bVar6 = Begin("Example: Documents",&ShowDemoWindow::show_app_documents,0x400);
    if (bVar6) {
      bVar6 = BeginMenuBar();
      if (bVar6) {
        bVar6 = BeginMenu("File",true);
        if (bVar6) {
          if ((long)ShowExampleAppDocuments(bool*)::app < 1) {
            iVar20 = 0;
          }
          else {
            lVar22 = 0;
            iVar20 = 0;
            do {
              iVar20 = iVar20 + (uint)*(byte *)(DAT_001f1b70 + 8 + lVar22);
              lVar22 = lVar22 + 0x20;
            } while ((long)ShowExampleAppDocuments(bool*)::app << 5 != lVar22);
          }
          bVar6 = BeginMenu("Open",iVar20 < ShowExampleAppDocuments(bool*)::app);
          if (bVar6) {
            if (0 < ShowExampleAppDocuments(bool*)::app) {
              lVar22 = 8;
              lVar27 = 0;
              do {
                lVar19 = DAT_001f1b70;
                if ((*(char *)(DAT_001f1b70 + lVar22) == '\0') &&
                   (bVar6 = MenuItem(*(char **)(DAT_001f1b70 + -8 + lVar22),(char *)0x0,false,true),
                   bVar6)) {
                  *(undefined1 *)(lVar19 + lVar22) = 1;
                }
                lVar27 = lVar27 + 1;
                lVar22 = lVar22 + 0x20;
              } while (lVar27 < ShowExampleAppDocuments(bool*)::app);
            }
            EndMenu();
          }
          bVar6 = MenuItem("Close All Documents",(char *)0x0,false,iVar20 != 0);
          lVar22 = DAT_001f1b70;
          if ((bVar6) && (lVar27 = (long)ShowExampleAppDocuments(bool*)::app, 0 < lVar27)) {
            lVar19 = 0;
            do {
              *(undefined1 *)(lVar22 + 0xb + lVar19) = 1;
              lVar19 = lVar19 + 0x20;
            } while (lVar27 * 0x20 != lVar19);
          }
          MenuItem("Exit","Alt+F4",false,true);
          EndMenu();
        }
        EndMenuBar();
      }
      local_60 = p_open;
      if (0 < ShowExampleAppDocuments(bool*)::app) {
        lVar27 = 8;
        lVar22 = 0;
        do {
          lVar19 = DAT_001f1b70;
          if (lVar22 != 0) {
            SameLine(0.0,-1.0);
          }
          puVar25 = (undefined8 *)(lVar27 + lVar19 + -8);
          PushID(puVar25);
          bVar6 = Checkbox((char *)*puVar25,(bool *)(lVar27 + lVar19));
          if ((bVar6) && (*(bool *)(lVar27 + lVar19) == false)) {
            *(undefined1 *)(lVar19 + lVar27) = 0;
            *(undefined1 *)(lVar19 + 2 + lVar27) = 0;
          }
          PopID();
          lVar22 = lVar22 + 1;
          lVar27 = lVar27 + 0x20;
        } while (lVar22 < ShowExampleAppDocuments(bool*)::app);
      }
      Separator();
      bVar6 = BeginTabBar("##tabs",0x41);
      if (bVar6) {
        if (0 < ShowExampleAppDocuments(bool*)::app) {
          lVar22 = 9;
          lVar27 = 0;
          do {
            lVar19 = DAT_001f1b70;
            if ((*(char *)(DAT_001f1b70 + -1 + lVar22) == '\0') &&
               (*(char *)(DAT_001f1b70 + lVar22) == '\x01')) {
              SetTabItemClosed(*(char **)(DAT_001f1b70 + -9 + lVar22));
            }
            *(undefined1 *)(lVar19 + lVar22) = *(undefined1 *)(lVar19 + -1 + lVar22);
            lVar27 = lVar27 + 1;
            lVar22 = lVar22 + 0x20;
          } while (lVar27 < ShowExampleAppDocuments(bool*)::app);
        }
        if (0 < ShowExampleAppDocuments(bool*)::app) {
          lVar27 = 8;
          lVar22 = 0;
          do {
            lVar19 = DAT_001f1b70;
            if (*(char *)(DAT_001f1b70 + lVar27) == '\x01') {
              bVar6 = BeginTabItem(*(char **)(DAT_001f1b70 + -8 + lVar27),
                                   (bool *)(DAT_001f1b70 + lVar27),
                                   (uint)*(byte *)(DAT_001f1b70 + 2 + lVar27));
              if ((*(char *)(lVar19 + lVar27) == '\0') && (*(char *)(lVar19 + 2 + lVar27) == '\x01')
                 ) {
                *(undefined1 *)(lVar19 + lVar27) = 1;
                *(undefined1 *)(lVar19 + 3 + lVar27) = 1;
              }
              doc = (MyDocument *)(lVar19 + lVar27 + -8);
              MyDocument::DisplayContextMenu(doc);
              if (bVar6) {
                MyDocument::DisplayContents(doc);
                EndTabItem();
              }
            }
            lVar22 = lVar22 + 1;
            lVar27 = lVar27 + 0x20;
          } while (lVar22 < ShowExampleAppDocuments(bool*)::app);
        }
        EndTabBar();
      }
      p_open = local_60;
      if (ShowExampleAppDocuments(bool*)::close_queue == '\0') {
        ShowDemoWindow();
      }
      if ((ShowExampleAppDocuments(bool*)::close_queue == 0) &&
         (0 < ShowExampleAppDocuments(bool*)::app)) {
        lVar22 = 0;
        lVar27 = 0;
        do {
          lVar19 = DAT_001f1b70;
          if (*(char *)(DAT_001f1b70 + 0xb + lVar22) == '\x01') {
            *(undefined1 *)(DAT_001f1b70 + 0xb + lVar22) = 0;
            if (ShowExampleAppDocuments(bool*)::close_queue == DAT_001f1b84) {
              if (DAT_001f1b84 == 0) {
                iVar20 = 8;
              }
              else {
                iVar20 = DAT_001f1b84 / 2 + DAT_001f1b84;
              }
              iVar11 = ShowExampleAppDocuments(bool*)::close_queue + 1;
              if (ShowExampleAppDocuments(bool*)::close_queue + 1 < iVar20) {
                iVar11 = iVar20;
              }
              if (DAT_001f1b84 < iVar11) {
                pvVar14 = MemAlloc((long)iVar11 << 3);
                if (DAT_001f1b88 != (void *)0x0) {
                  memcpy(pvVar14,DAT_001f1b88,(long)ShowExampleAppDocuments(bool*)::close_queue << 3
                        );
                  MemFree(DAT_001f1b88);
                }
                _close_queue = CONCAT44(iVar11,ShowExampleAppDocuments(bool*)::close_queue);
                DAT_001f1b88 = pvVar14;
              }
            }
            *(long *)((long)DAT_001f1b88 + (long)ShowExampleAppDocuments(bool*)::close_queue * 8) =
                 lVar19 + lVar22;
            ShowExampleAppDocuments(bool*)::close_queue =
                 ShowExampleAppDocuments(bool*)::close_queue + 1;
          }
          lVar27 = lVar27 + 1;
          lVar22 = lVar22 + 0x20;
        } while (lVar27 < ShowExampleAppDocuments(bool*)::app);
      }
      pvVar14 = DAT_001f1b88;
      uVar18 = _close_queue & 0xffffffff;
      if (uVar18 != 0) {
        if (ShowExampleAppDocuments(bool*)::close_queue < 1) {
          iVar20 = 0;
        }
        else {
          uVar17 = 0;
          iVar20 = 0;
          do {
            iVar20 = iVar20 + (uint)*(byte *)(*(long *)((long)DAT_001f1b88 + uVar17 * 8) + 10);
            uVar17 = uVar17 + 1;
          } while (uVar18 != uVar17);
        }
        if (iVar20 == 0) {
          if (0 < ShowExampleAppDocuments(bool*)::close_queue) {
            uVar17 = 0;
            do {
              lVar22 = *(long *)((long)pvVar14 + uVar17 * 8);
              *(undefined1 *)(lVar22 + 8) = 0;
              *(undefined1 *)(lVar22 + 10) = 0;
              uVar17 = uVar17 + 1;
            } while (uVar18 != uVar17);
          }
          if (DAT_001f1b88 != (void *)0x0) {
            _close_queue = 0;
            MemFree(DAT_001f1b88);
            DAT_001f1b88 = (void *)0x0;
          }
        }
        else {
          bVar6 = IsPopupOpen("Save?");
          if (!bVar6) {
            OpenPopup("Save?");
          }
          bVar6 = BeginPopupModal("Save?",(bool *)0x0,0);
          if (bVar6) {
            Text("Save change to the following items?");
            SetNextItemWidth(-1.0);
            bVar6 = ListBoxHeader("##",iVar20,6);
            if (bVar6) {
              if (0 < ShowExampleAppDocuments(bool*)::close_queue) {
                lVar22 = 0;
                do {
                  puVar25 = *(undefined8 **)((long)DAT_001f1b88 + lVar22 * 8);
                  if (*(char *)((long)puVar25 + 10) == '\x01') {
                    Text("%s",*puVar25);
                  }
                  lVar22 = lVar22 + 1;
                } while (lVar22 < ShowExampleAppDocuments(bool*)::close_queue);
              }
              ListBoxFooter();
            }
            local_e8._0_4_ = 80.0;
            local_e8._4_4_ = 0.0;
            bVar6 = Button("Yes",(ImVec2 *)local_e8);
            pvVar14 = DAT_001f1b88;
            if (bVar6) {
              lVar22 = (long)ShowExampleAppDocuments(bool*)::close_queue;
              if (0 < lVar22) {
                lVar27 = 0;
                do {
                  lVar19 = *(long *)((long)pvVar14 + lVar27 * 8);
                  if (*(char *)(lVar19 + 10) == '\x01') {
                    *(undefined1 *)(lVar19 + 10) = 0;
                  }
                  *(undefined1 *)(lVar19 + 8) = 0;
                  *(undefined1 *)(lVar19 + 10) = 0;
                  lVar27 = lVar27 + 1;
                } while (lVar22 != lVar27);
              }
              if (DAT_001f1b88 != (void *)0x0) {
                _close_queue = 0;
                MemFree(DAT_001f1b88);
                DAT_001f1b88 = (void *)0x0;
              }
              CloseCurrentPopup();
            }
            SameLine(0.0,-1.0);
            local_e8._0_4_ = 80.0;
            local_e8._4_4_ = 0.0;
            bVar6 = Button("No",(ImVec2 *)local_e8);
            pvVar14 = DAT_001f1b88;
            if (bVar6) {
              lVar22 = (long)ShowExampleAppDocuments(bool*)::close_queue;
              if (0 < lVar22) {
                lVar27 = 0;
                do {
                  lVar19 = *(long *)((long)pvVar14 + lVar27 * 8);
                  *(undefined1 *)(lVar19 + 8) = 0;
                  *(undefined1 *)(lVar19 + 10) = 0;
                  lVar27 = lVar27 + 1;
                } while (lVar22 != lVar27);
              }
              if (DAT_001f1b88 != (void *)0x0) {
                _close_queue = 0;
                MemFree(DAT_001f1b88);
                DAT_001f1b88 = (void *)0x0;
              }
              CloseCurrentPopup();
            }
            SameLine(0.0,-1.0);
            local_e8._0_4_ = 80.0;
            local_e8._4_4_ = 0.0;
            bVar6 = Button("Cancel",(ImVec2 *)local_e8);
            if (bVar6) {
              if (DAT_001f1b88 != (void *)0x0) {
                _close_queue = 0;
                MemFree(DAT_001f1b88);
                DAT_001f1b88 = (void *)0x0;
              }
              CloseCurrentPopup();
            }
            EndPopup();
          }
        }
      }
    }
    End();
  }
  if ((ShowDemoWindow::show_app_main_menu_bar == true) && (bVar6 = BeginMainMenuBar(), bVar6)) {
    bVar6 = BeginMenu("File",true);
    if (bVar6) {
      ShowExampleMenuFile();
      EndMenu();
    }
    bVar6 = BeginMenu("Edit",true);
    if (bVar6) {
      MenuItem("Undo","CTRL+Z",false,true);
      MenuItem("Redo","CTRL+Y",false,false);
      Separator();
      MenuItem("Cut","CTRL+X",false,true);
      MenuItem("Copy","CTRL+C",false,true);
      MenuItem("Paste","CTRL+V",false,true);
      EndMenu();
    }
    EndMainMenuBar();
  }
  if (ShowDemoWindow::show_app_console == true) {
    if ((ShowExampleAppConsole(bool*)::console == '\0') &&
       (iVar20 = __cxa_guard_acquire(&ShowExampleAppConsole(bool*)::console), iVar20 != 0)) {
      ExampleAppConsole::ExampleAppConsole
                ((ExampleAppConsole *)ShowExampleAppConsole(bool*)::console);
      __cxa_atexit(ExampleAppConsole::~ExampleAppConsole,ShowExampleAppConsole(bool*)::console,
                   &__dso_handle);
      __cxa_guard_release(&ShowExampleAppConsole(bool*)::console);
    }
    ExampleAppConsole::Draw
              ((ExampleAppConsole *)ShowExampleAppConsole(bool*)::console,"Example: Console",
               &ShowDemoWindow::show_app_console);
  }
  if (ShowDemoWindow::show_app_log == true) {
    local_60 = p_open;
    if ((ShowExampleAppLog(bool*)::log == '\0') &&
       (iVar20 = __cxa_guard_acquire(&ShowExampleAppLog(bool*)::log), iVar20 != 0)) {
      ExampleAppLog::ExampleAppLog((ExampleAppLog *)ShowExampleAppLog(bool*)::log);
      __cxa_atexit(ExampleAppLog::~ExampleAppLog,ShowExampleAppLog(bool*)::log,&__dso_handle);
      __cxa_guard_release(&ShowExampleAppLog(bool*)::log);
    }
    local_e8._0_4_ = 500.0;
    local_e8._4_4_ = 400.0;
    SetNextWindowSize((ImVec2 *)local_e8,4);
    Begin("Example: Log",&ShowDemoWindow::show_app_log,0);
    bVar6 = SmallButton("[Debug] Add 5 entries");
    if (bVar6) {
      iVar20 = 5;
      do {
        uVar9 = GetFrameCount();
        dVar3 = GetTime();
        ExampleAppLog::AddLog
                  ((ExampleAppLog *)ShowExampleAppLog(bool*)::log,
                   "[%05d] [%s] Hello, current time is %.1f, here\'s a word: \'%s\'\n",
                   SUB84(dVar3,0),(ulong)uVar9);
        ShowExampleAppLog(bool*)::counter = ShowExampleAppLog(bool*)::counter + 1;
        iVar20 = iVar20 + -1;
      } while (iVar20 != 0);
    }
    End();
    ExampleAppLog::Draw((ExampleAppLog *)ShowExampleAppLog(bool*)::log,"Example: Log",
                        &ShowDemoWindow::show_app_log);
    p_open = local_60;
  }
  if (ShowDemoWindow::show_app_layout == true) {
    local_e8._0_4_ = 500.0;
    local_e8._4_4_ = 440.0;
    SetNextWindowSize((ImVec2 *)local_e8,4);
    bVar6 = Begin("Example: Simple layout",&ShowDemoWindow::show_app_layout,0x400);
    if (bVar6) {
      bVar6 = BeginMenuBar();
      if (bVar6) {
        bVar6 = BeginMenu("File",true);
        if (bVar6) {
          bVar6 = MenuItem("Close",(char *)0x0,false,true);
          if (bVar6) {
            ShowDemoWindow::show_app_layout = false;
          }
          EndMenu();
        }
        EndMenuBar();
      }
      local_e8._0_4_ = 150.0;
      local_e8._4_4_ = 0.0;
      BeginChild("left pane",(ImVec2 *)local_e8,true,0);
      uVar18 = 0;
      do {
        iVar20 = (int)uVar18;
        sprintf((char *)local_e8,"MyObject %d",uVar18);
        local_128.x = 0.0;
        local_128.y = 0.0;
        bVar6 = Selectable((char *)local_e8,iVar20 == ShowExampleAppLayout(bool*)::selected,0,
                           &local_128);
        if (bVar6) {
          ShowExampleAppLayout(bool*)::selected = iVar20;
        }
        uVar18 = (ulong)(iVar20 + 1U);
      } while (iVar20 + 1U != 100);
      EndChild();
      SameLine(0.0,-1.0);
      BeginGroup();
      fVar29 = GetFrameHeightWithSpacing();
      local_e8._0_8_ = (ulong)(uint)fVar29 << 0x20 ^ 0x8000000000000000;
      BeginChild("item view",(ImVec2 *)local_e8,false,0);
      Text("MyObject: %d");
      Separator();
      bVar6 = BeginTabBar("##Tabs",0);
      if (bVar6) {
        bVar6 = BeginTabItem("Description",(bool *)0x0,0);
        if (bVar6) {
          TextWrapped(
                     "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. "
                     );
          EndTabItem();
        }
        bVar6 = BeginTabItem("Details",(bool *)0x0,0);
        if (bVar6) {
          Text("ID: 0123456789");
          EndTabItem();
        }
        EndTabBar();
      }
      EndChild();
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      Button("Revert",(ImVec2 *)local_e8);
      SameLine(0.0,-1.0);
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      Button("Save",(ImVec2 *)local_e8);
      EndGroup();
    }
    End();
  }
  if (ShowDemoWindow::show_app_property_editor == true) {
    local_e8._0_4_ = 430.0;
    local_e8._4_4_ = 450.0;
    SetNextWindowSize((ImVec2 *)local_e8,4);
    iVar20 = 0;
    bVar6 = Begin("Example: Property editor",&ShowDemoWindow::show_app_property_editor,0);
    if (bVar6) {
      HelpMarker(
                "This example shows how you may implement a property editor using two columns.\nAll objects/fields data are dummies here.\nRemember that in many simple cases, you can use ImGui::SameLine(xxx) to position\nyour cursor horizontally instead of using the Columns() API."
                );
      local_e8._0_4_ = 2.0;
      local_e8._4_4_ = 2.0;
      PushStyleVar(10,(ImVec2 *)local_e8);
      Columns(2,(char *)0x0,true);
      Separator();
      do {
        anon_func::funcs::ShowDummyObject("Object",iVar20);
        iVar20 = iVar20 + 1;
      } while (iVar20 != 3);
      Columns(1,(char *)0x0,true);
      Separator();
      PopStyleVar(1);
    }
    End();
  }
  if (ShowDemoWindow::show_app_long_text == true) {
    local_e8._0_4_ = 520.0;
    local_e8._4_4_ = 600.0;
    SetNextWindowSize((ImVec2 *)local_e8,4);
    bVar6 = Begin("Example: Long text display",&ShowDemoWindow::show_app_long_text,0);
    if (bVar6) {
      if (ShowExampleAppLongText(bool*)::log == '\0') {
        ShowDemoWindow();
      }
      Text("Printing unusually long amount of text.");
      Combo("Test type",&ShowExampleAppLongText(bool*)::test_type,"Single call to TextUnformatted()"
            ,-1);
      uVar18 = (ulong)(ShowExampleAppLongText(bool*)::log - 1);
      if (ShowExampleAppLongText(bool*)::log == 0) {
        uVar18 = 0;
      }
      Text("Buffer contents: %d lines, %d bytes",(ulong)ShowExampleAppLongText(bool*)::lines,uVar18)
      ;
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      bVar6 = Button("Clear",(ImVec2 *)local_e8);
      if (bVar6) {
        if (DAT_001f1b10 != (char *)0x0) {
          _log = 0;
          MemFree(DAT_001f1b10);
          DAT_001f1b10 = (char *)0x0;
        }
        ShowExampleAppLongText(bool*)::lines = 0;
      }
      SameLine(0.0,-1.0);
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      bVar6 = Button("Add 1000 lines",(ImVec2 *)local_e8);
      if (bVar6) {
        iVar20 = 0;
        do {
          ImGuiTextBuffer::appendf
                    ((ImGuiTextBuffer *)&ShowExampleAppLongText(bool*)::log,
                     "%i The quick brown fox jumps over the lazy dog\n",
                     (ulong)(ShowExampleAppLongText(bool*)::lines + iVar20));
          iVar20 = iVar20 + 1;
        } while (iVar20 != 1000);
        ShowExampleAppLongText(bool*)::lines = ShowExampleAppLongText(bool*)::lines + 1000;
      }
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      BeginChild("Log",(ImVec2 *)local_e8,false,0);
      if (ShowExampleAppLongText(bool*)::test_type == 2) {
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        PushStyleVar(0xd,(ImVec2 *)local_e8);
        if (0 < (int)ShowExampleAppLongText(bool*)::lines) {
          uVar18 = 0;
          do {
            Text("%i The quick brown fox jumps over the lazy dog",uVar18);
            uVar9 = (int)uVar18 + 1;
            uVar18 = (ulong)uVar9;
          } while ((int)uVar9 < (int)ShowExampleAppLongText(bool*)::lines);
        }
        PopStyleVar(1);
      }
      else if (ShowExampleAppLongText(bool*)::test_type == 1) {
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        PushStyleVar(0xd,(ImVec2 *)local_e8);
        ImGuiListClipper::Begin
                  ((ImGuiListClipper *)local_e8,ShowExampleAppLongText(bool*)::lines,-1.0);
        while (bVar6 = ImGuiListClipper::Step((ImGuiListClipper *)local_e8), bVar6) {
          uVar9 = (uint)local_d8;
          while( true ) {
            if (local_d8._4_4_ <= (int)uVar9) break;
            Text("%i The quick brown fox jumps over the lazy dog",(ulong)uVar9);
            uVar9 = uVar9 + 1;
          }
        }
        PopStyleVar(1);
        if ((float)local_e8._8_4_ != -NAN) goto LAB_00128723;
      }
      else if (ShowExampleAppLongText(bool*)::test_type == 0) {
        pcVar23 = ImGuiTextBuffer::EmptyString;
        pcVar24 = ImGuiTextBuffer::EmptyString;
        if ((DAT_001f1b10 != (char *)0x0) &&
           (pcVar24 = DAT_001f1b10, ShowExampleAppLongText(bool*)::log < 1)) {
          __assert_fail("Size > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                        ,0x4ef,"const T &ImVector<char>::front() const [T = char]");
        }
        if (DAT_001f1b10 != (char *)0x0) {
          if ((long)ShowExampleAppLongText(bool*)::log < 1) {
            __assert_fail("Size > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                          ,0x4f1,"const T &ImVector<char>::back() const [T = char]");
          }
          pcVar23 = DAT_001f1b10 + (long)ShowExampleAppLongText(bool*)::log + -1;
        }
        TextUnformatted(pcVar24,pcVar23);
      }
      EndChild();
    }
    End();
  }
  if (ShowDemoWindow::show_app_auto_resize == true) {
    bVar6 = Begin("Example: Auto-resizing window",&ShowDemoWindow::show_app_auto_resize,0x40);
    if (bVar6) {
      Text(
          "Window will resize every-frame to the size of its content.\nNote that you probably don\'t want to query the window size to\noutput your content because that would create a feedback loop."
          );
      SliderInt("Number of lines",&ShowExampleAppAutoResize(bool*)::lines,1,0x14,"%d");
      if (0 < ShowExampleAppAutoResize(bool*)::lines) {
        uVar18 = 0;
        iVar20 = 0;
        do {
          Text("%*sThis is line %d",uVar18,"");
          iVar20 = iVar20 + 1;
          uVar18 = (ulong)((int)uVar18 + 4);
        } while (iVar20 < ShowExampleAppAutoResize(bool*)::lines);
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_constrained_resize == true) {
    if (ShowExampleAppConstrainedResize(bool*)::type == 0) {
      local_e8._0_4_ = -1.0;
      local_e8._4_4_ = 0.0;
      local_128.x = -1.0;
      local_128.y = 3.4028235e+38;
      SetNextWindowSizeConstraints((ImVec2 *)local_e8,&local_128,(ImGuiSizeCallback)0x0,(void *)0x0)
      ;
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 1) {
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = -1.0;
      local_128.x = 3.4028235e+38;
      local_128.y = -1.0;
      SetNextWindowSizeConstraints((ImVec2 *)local_e8,&local_128,(ImGuiSizeCallback)0x0,(void *)0x0)
      ;
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 2) {
      local_e8._0_4_ = 100.0;
      local_e8._4_4_ = 100.0;
      local_128.x = 3.4028235e+38;
      local_128.y = 3.4028235e+38;
      SetNextWindowSizeConstraints((ImVec2 *)local_e8,&local_128,(ImGuiSizeCallback)0x0,(void *)0x0)
      ;
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 3) {
      local_e8._0_4_ = 400.0;
      local_e8._4_4_ = -1.0;
      local_128.x = 500.0;
      local_128.y = -1.0;
      SetNextWindowSizeConstraints((ImVec2 *)local_e8,&local_128,(ImGuiSizeCallback)0x0,(void *)0x0)
      ;
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 4) {
      local_e8._0_4_ = -1.0;
      local_e8._4_4_ = 400.0;
      local_128.x = -1.0;
      local_128.y = 500.0;
      SetNextWindowSizeConstraints((ImVec2 *)local_e8,&local_128,(ImGuiSizeCallback)0x0,(void *)0x0)
      ;
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 5) {
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      local_128.x = 3.4028235e+38;
      local_128.y = 3.4028235e+38;
      SetNextWindowSizeConstraints
                ((ImVec2 *)local_e8,&local_128,
                 ShowExampleAppConstrainedResize::CustomConstraints::Square,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 6) {
      local_e8._0_4_ = 0.0;
      local_e8._4_4_ = 0.0;
      local_128.x = 3.4028235e+38;
      local_128.y = 3.4028235e+38;
      SetNextWindowSizeConstraints
                ((ImVec2 *)local_e8,&local_128,
                 ShowExampleAppConstrainedResize::CustomConstraints::Step,(void *)0x64);
    }
    bVar6 = Begin("Example: Constrained Resize",&ShowDemoWindow::show_app_constrained_resize,
                  (uint)ShowExampleAppConstrainedResize(bool*)::auto_resize << 6);
    if (bVar6) {
      local_b8 = "Custom: Fixed Steps (100)";
      local_c8 = "Height 400-500";
      pcStack_c0 = "Custom: Always Square";
      local_d8 = "Width > 100, Height > 100";
      pcStack_d0 = "Width 400-500";
      local_e8._0_8_ = "Resize vertical only";
      local_e8._8_8_ = "Resize horizontal only";
      local_128.x = 0.0;
      local_128.y = 0.0;
      bVar6 = Button("200x200",&local_128);
      if (bVar6) {
        local_128.x = 200.0;
        local_128.y = 200.0;
        SetWindowSize(&local_128,0);
      }
      SameLine(0.0,-1.0);
      local_128.x = 0.0;
      local_128.y = 0.0;
      bVar6 = Button("500x500",&local_128);
      if (bVar6) {
        local_128.x = 500.0;
        local_128.y = 500.0;
        SetWindowSize(&local_128,0);
      }
      SameLine(0.0,-1.0);
      local_128.x = 0.0;
      local_128.y = 0.0;
      bVar6 = Button("800x200",&local_128);
      if (bVar6) {
        local_128.x = 800.0;
        local_128.y = 200.0;
        SetWindowSize(&local_128,0);
      }
      SetNextItemWidth(200.0);
      Combo("Constraint",&ShowExampleAppConstrainedResize(bool*)::type,(char **)local_e8,7,-1);
      SetNextItemWidth(200.0);
      DragInt("Lines",&ShowExampleAppConstrainedResize(bool*)::display_lines,0.2,1,100,"%d");
      Checkbox("Auto-resize",(bool *)&ShowExampleAppConstrainedResize(bool*)::auto_resize);
      if (0 < ShowExampleAppConstrainedResize(bool*)::display_lines) {
        uVar18 = 0;
        iVar20 = 0;
        do {
          Text("%*sHello, sailor! Making this line long enough for the example.",uVar18,"");
          iVar20 = iVar20 + 1;
          uVar18 = (ulong)((int)uVar18 + 4);
        } while (iVar20 < ShowExampleAppConstrainedResize(bool*)::display_lines);
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_simple_overlay == true) {
    pIVar15 = GetIO();
    if (ShowExampleAppSimpleOverlay(bool*)::corner != 0xffffffff) {
      local_e8._4_4_ = 10.0;
      local_e8._0_4_ = 10.0;
      bVar6 = (ShowExampleAppSimpleOverlay(bool*)::corner & 1) != 0;
      if (bVar6) {
        local_e8._0_4_ = (pIVar15->DisplaySize).x + -10.0;
      }
      local_128.x = 0.0;
      if (bVar6) {
        local_128.x = 1.0;
      }
      bVar6 = (ShowExampleAppSimpleOverlay(bool*)::corner & 2) != 0;
      if (bVar6) {
        local_e8._4_4_ = (pIVar15->DisplaySize).y + -10.0;
      }
      local_128.y = 0.0;
      if (bVar6) {
        local_128.y = 1.0;
      }
      SetNextWindowPos((ImVec2 *)local_e8,1,&local_128);
    }
    SetNextWindowBgAlpha(0.35);
    bVar6 = Begin("Example: Simple overlay",&ShowDemoWindow::show_app_simple_overlay,
                  (uint)(ShowExampleAppSimpleOverlay(bool*)::corner != 0xffffffff) * 4 + 0xc116b);
    if (bVar6) {
      Text("Simple overlay\nin the corner of the screen.\n(right-click to change position)");
      Separator();
      bVar6 = IsMousePosValid((ImVec2 *)0x0);
      if (bVar6) {
        Text("Mouse Position: (%.1f,%.1f)",SUB84((double)(pIVar15->MousePos).x,0));
      }
      else {
        Text("Mouse Position: <invalid>");
      }
      bVar6 = BeginPopupContextWindow((char *)0x0,1,true);
      if (bVar6) {
        bVar6 = MenuItem("Custom",(char *)0x0,
                         ShowExampleAppSimpleOverlay(bool*)::corner == 0xffffffff,true);
        if (bVar6) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 0xffffffff;
        }
        bVar6 = MenuItem("Top-left",(char *)0x0,ShowExampleAppSimpleOverlay(bool*)::corner == 0,true
                        );
        if (bVar6) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 0;
        }
        bVar6 = MenuItem("Top-right",(char *)0x0,ShowExampleAppSimpleOverlay(bool*)::corner == 1,
                         true);
        if (bVar6) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 1;
        }
        bVar6 = MenuItem("Bottom-left",(char *)0x0,ShowExampleAppSimpleOverlay(bool*)::corner == 2,
                         true);
        if (bVar6) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 2;
        }
        bVar6 = MenuItem("Bottom-right",(char *)0x0,ShowExampleAppSimpleOverlay(bool*)::corner == 3,
                         true);
        if (bVar6) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 3;
        }
        bVar6 = MenuItem("Close",(char *)0x0,false,true);
        if (bVar6) {
          ShowDemoWindow::show_app_simple_overlay = false;
        }
        EndPopup();
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_window_titles == true) {
    local_e8._0_4_ = 100.0;
    local_e8._4_4_ = 100.0;
    local_128.x = 0.0;
    local_128.y = 0.0;
    SetNextWindowPos((ImVec2 *)local_e8,4,&local_128);
    Begin("Same title as another window##1",(bool *)0x0,0);
    Text("This is window 1.\nMy title is the same as window 2, but my identifier is unique.");
    End();
    local_e8._0_4_ = 100.0;
    local_e8._4_4_ = 200.0;
    local_128.x = 0.0;
    local_128.y = 0.0;
    SetNextWindowPos((ImVec2 *)local_e8,4,&local_128);
    Begin("Same title as another window##2",(bool *)0x0,0);
    Text("This is window 2.\nMy title is the same as window 1, but my identifier is unique.");
    End();
    dVar3 = GetTime();
    cVar1 = "|/-\\"[(int)(dVar3 * 4.0) & 3];
    uVar9 = GetFrameCount();
    sprintf(local_e8,"Animated title %c %d###AnimatedTitle",(ulong)(uint)(int)cVar1,(ulong)uVar9);
    local_128.x = 100.0;
    local_128.y = 300.0;
    local_f0.x = 0.0;
    local_f0.y = 0.0;
    SetNextWindowPos(&local_128,4,&local_f0);
    Begin(local_e8,(bool *)0x0,0);
    Text("This window has a changing title.");
    End();
  }
  if (ShowDemoWindow::show_app_custom_rendering == true) {
    bVar6 = Begin("Example: Custom rendering",&ShowDemoWindow::show_app_custom_rendering,0);
    if (bVar6) {
      pIVar16 = GetWindowDrawList();
      bVar6 = BeginTabBar("##TabBar",0);
      if (bVar6) {
        bVar6 = BeginTabItem("Primitives",(bool *)0x0,0);
        if (bVar6) {
          local_60 = p_open;
          if (ShowExampleAppCustomRendering(bool*)::colf == '\0') {
            ShowDemoWindow();
          }
          DragFloat("Size",&ShowExampleAppCustomRendering(bool*)::sz,0.2,2.0,72.0,"%.0f",1.0);
          DragFloat("Thickness",&ShowExampleAppCustomRendering(bool*)::thickness,0.05,1.0,8.0,
                    "%.02f",1.0);
          iVar20 = 0;
          ColorEdit4("Color",(float *)ShowExampleAppCustomRendering(bool*)::colf,0);
          IVar4 = GetCursorScreenPos();
          fStack_110 = (float)extraout_XMM0_Dc;
          local_118._0_4_ = IVar4.x;
          local_118._4_4_ = IVar4.y;
          fStack_10c = (float)extraout_XMM0_Dd;
          local_e8._0_8_ = ShowExampleAppCustomRendering(bool*)::colf._0_8_;
          local_e8._8_8_ = ShowExampleAppCustomRendering(bool*)::colf._8_8_;
          IVar10 = ColorConvertFloat4ToU32((ImVec4 *)local_e8);
          local_48 = (float)local_118._0_4_ + 4.0;
          fStack_44 = (float)local_118._4_4_;
          uStack_40 = fStack_110;
          uStack_3c = fStack_10c;
          local_118._0_4_ = (float)local_118._4_4_ + 4.0;
          fStack_110 = (float)local_118._4_4_;
          fStack_10c = (float)local_118._4_4_;
          do {
            fVar29 = 1.0;
            if (iVar20 != 0) {
              fVar29 = ShowExampleAppCustomRendering(bool*)::thickness;
            }
            local_108._0_4_ = fVar29;
            fVar30 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
            local_e8._4_4_ = fVar30 + (float)local_118._0_4_;
            local_e8._0_4_ = fVar30 + local_48;
            ImDrawList::AddCircle(pIVar16,(ImVec2 *)local_e8,fVar30,IVar10,6,fVar29);
            local_11c = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + local_48;
            fVar29 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
            local_e8._4_4_ = fVar29 + (float)local_118._0_4_;
            local_e8._0_4_ = fVar29 + local_11c;
            ImDrawList::AddCircle
                      (pIVar16,(ImVec2 *)local_e8,fVar29,IVar10,0x14,(float)local_108._0_4_);
            local_11c = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + local_11c;
            local_e8._4_4_ = local_118._0_4_;
            local_e8._0_4_ = local_11c;
            local_128.y = (float)local_118._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
            local_128.x = ShowExampleAppCustomRendering(bool*)::sz + local_11c;
            ImDrawList::AddRect(pIVar16,(ImVec2 *)local_e8,&local_128,IVar10,0.0,0,
                                (float)local_108._0_4_);
            local_11c = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + local_11c;
            local_e8._4_4_ = local_118._0_4_;
            local_e8._0_4_ = local_11c;
            local_128.y = (float)local_118._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
            local_128.x = ShowExampleAppCustomRendering(bool*)::sz + local_11c;
            ImDrawList::AddRect(pIVar16,(ImVec2 *)local_e8,&local_128,IVar10,10.0,0xf,
                                (float)local_108._0_4_);
            local_11c = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + local_11c;
            local_e8._4_4_ = local_118._0_4_;
            local_e8._0_4_ = local_11c;
            local_128.y = (float)local_118._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
            local_128.x = ShowExampleAppCustomRendering(bool*)::sz + local_11c;
            ImDrawList::AddRect(pIVar16,(ImVec2 *)local_e8,&local_128,IVar10,10.0,9,
                                (float)local_108._0_4_);
            local_11c = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + local_11c;
            local_e8._4_4_ = local_118._0_4_;
            local_e8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz * 0.5 + local_11c;
            local_128.y = (float)local_118._0_4_ + ShowExampleAppCustomRendering(bool*)::sz + -0.5;
            local_128.x = ShowExampleAppCustomRendering(bool*)::sz + local_11c;
            local_f0.y = local_128.y;
            local_f0.x = local_11c;
            ImDrawList::AddTriangle
                      (pIVar16,(ImVec2 *)local_e8,&local_128,&local_f0,IVar10,(float)local_108._0_4_
                      );
            local_11c = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + local_11c;
            local_e8._4_4_ = local_118._0_4_;
            local_e8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz * 0.2 + local_11c;
            local_128.y = (float)local_118._0_4_ + ShowExampleAppCustomRendering(bool*)::sz + -0.5;
            local_128.x = local_11c;
            local_f0.y = local_128.y;
            local_f0.x = ShowExampleAppCustomRendering(bool*)::sz * 0.4 + local_11c;
            ImDrawList::AddTriangle
                      (pIVar16,(ImVec2 *)local_e8,&local_128,&local_f0,IVar10,(float)local_108._0_4_
                      );
            local_11c = ShowExampleAppCustomRendering(bool*)::sz * 0.4 + 10.0 + local_11c;
            local_e8._4_4_ = local_118._0_4_;
            local_e8._0_4_ = local_11c;
            local_128.y = (float)local_118._0_4_;
            local_128.x = ShowExampleAppCustomRendering(bool*)::sz + local_11c;
            ImDrawList::AddLine(pIVar16,(ImVec2 *)local_e8,&local_128,IVar10,(float)local_108._0_4_)
            ;
            local_11c = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + local_11c;
            local_e8._4_4_ = local_118._0_4_;
            local_e8._0_4_ = local_11c;
            local_128.y = ShowExampleAppCustomRendering(bool*)::sz + (float)local_118._0_4_;
            local_128.x = local_11c;
            ImDrawList::AddLine(pIVar16,(ImVec2 *)local_e8,&local_128,IVar10,(float)local_108._0_4_)
            ;
            local_11c = local_11c + 10.0;
            local_e8._4_4_ = local_118._0_4_;
            local_e8._0_4_ = local_11c;
            local_128.y = ShowExampleAppCustomRendering(bool*)::sz + (float)local_118._0_4_;
            local_128.x = local_11c + ShowExampleAppCustomRendering(bool*)::sz;
            ImDrawList::AddLine(pIVar16,(ImVec2 *)local_e8,&local_128,IVar10,(float)local_108._0_4_)
            ;
            local_e8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + local_11c;
            local_e8._4_4_ = local_118._0_4_;
            local_58.x = (float)local_e8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
            local_58.y = ShowExampleAppCustomRendering(bool*)::sz + (float)local_118._0_4_;
            local_128.y = ShowExampleAppCustomRendering(bool*)::sz * 0.3 + (float)local_118._0_4_;
            local_128.x = ShowExampleAppCustomRendering(bool*)::sz * 1.3 + (float)local_e8._0_4_;
            local_f0.y = local_58.y - ShowExampleAppCustomRendering(bool*)::sz * 0.3;
            local_f0.x = local_58.x - ShowExampleAppCustomRendering(bool*)::sz * 1.3;
            ImDrawList::AddBezierCurve
                      (pIVar16,(ImVec2 *)local_e8,&local_128,&local_f0,&local_58,IVar10,
                       (float)local_108._0_4_,0);
            local_118._0_4_ =
                 (float)local_118._0_4_ + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
            iVar20 = iVar20 + 1;
          } while (iVar20 == 1);
          fVar29 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
          local_e8._4_4_ = fVar29 + (float)local_118._0_4_;
          local_e8._0_4_ = fVar29 + local_48;
          ImDrawList::AddCircleFilled(pIVar16,(ImVec2 *)local_e8,fVar29,IVar10,6);
          fVar30 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + local_48;
          fVar29 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
          local_e8._4_4_ = fVar29 + (float)local_118._0_4_;
          local_e8._0_4_ = fVar29 + fVar30;
          local_108._0_4_ = fVar30;
          ImDrawList::AddCircleFilled(pIVar16,(ImVec2 *)local_e8,fVar29,IVar10,0x20);
          local_108._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_
          ;
          local_e8._4_4_ = local_118._0_4_;
          local_e8._0_4_ = local_108._0_4_;
          local_128.y = (float)local_118._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          local_128.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_108._0_4_;
          ImDrawList::AddRectFilled(pIVar16,(ImVec2 *)local_e8,&local_128,IVar10,0.0,0xf);
          local_108._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_
          ;
          local_e8._4_4_ = local_118._0_4_;
          local_e8._0_4_ = local_108._0_4_;
          local_128.y = (float)local_118._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          local_128.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_108._0_4_;
          ImDrawList::AddRectFilled(pIVar16,(ImVec2 *)local_e8,&local_128,IVar10,10.0,0xf);
          local_108._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_
          ;
          local_e8._4_4_ = local_118._0_4_;
          local_e8._0_4_ = local_108._0_4_;
          local_128.y = (float)local_118._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          local_128.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_108._0_4_;
          ImDrawList::AddRectFilled(pIVar16,(ImVec2 *)local_e8,&local_128,IVar10,10.0,9);
          local_108._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_
          ;
          local_e8._4_4_ = local_118._0_4_;
          local_e8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz * 0.5 + (float)local_108._0_4_;
          local_128.y = (float)local_118._0_4_ + ShowExampleAppCustomRendering(bool*)::sz + -0.5;
          local_128.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_108._0_4_;
          local_f0.y = local_128.y;
          local_f0.x = (float)local_108._0_4_;
          ImDrawList::AddTriangleFilled(pIVar16,(ImVec2 *)local_e8,&local_128,&local_f0,IVar10);
          local_108._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_
          ;
          local_e8._4_4_ = local_118._0_4_;
          local_e8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz * 0.2 + (float)local_108._0_4_;
          local_128.y = (float)local_118._0_4_ + ShowExampleAppCustomRendering(bool*)::sz + -0.5;
          local_128.x = (float)local_108._0_4_;
          local_f0.y = local_128.y;
          local_f0.x = ShowExampleAppCustomRendering(bool*)::sz * 0.4 + (float)local_108._0_4_;
          ImDrawList::AddTriangleFilled(pIVar16,(ImVec2 *)local_e8,&local_128,&local_f0,IVar10);
          local_108._0_4_ =
               ShowExampleAppCustomRendering(bool*)::sz * 0.4 + 10.0 + (float)local_108._0_4_;
          local_e8._4_4_ = local_118._0_4_;
          local_e8._0_4_ = local_108._0_4_;
          local_128.y = ShowExampleAppCustomRendering(bool*)::thickness + (float)local_118._0_4_;
          local_128.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_108._0_4_;
          ImDrawList::AddRectFilled(pIVar16,(ImVec2 *)local_e8,&local_128,IVar10,0.0,0xf);
          local_108._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_
          ;
          local_e8._4_4_ = local_118._0_4_;
          local_e8._0_4_ = local_108._0_4_;
          local_128.y = ShowExampleAppCustomRendering(bool*)::sz + (float)local_118._0_4_;
          local_128.x = ShowExampleAppCustomRendering(bool*)::thickness + (float)local_108._0_4_;
          ImDrawList::AddRectFilled(pIVar16,(ImVec2 *)local_e8,&local_128,IVar10,0.0,0xf);
          local_108._0_4_ = (float)local_108._0_4_ + 20.0;
          local_e8._4_4_ = local_118._0_4_;
          local_e8._0_4_ = local_108._0_4_;
          local_128.y = (float)local_118._0_4_ + 1.0;
          local_128.x = (float)local_108._0_4_ + 1.0;
          ImDrawList::AddRectFilled(pIVar16,(ImVec2 *)local_e8,&local_128,IVar10,0.0,0xf);
          local_e8._4_4_ = local_118._0_4_;
          local_e8._0_4_ = (float)local_108._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          local_128.y = (float)local_118._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          local_128.x = (float)local_108._0_4_ + ShowExampleAppCustomRendering(bool*)::sz +
                        ShowExampleAppCustomRendering(bool*)::sz;
          ImDrawList::AddRectFilledMultiColor
                    (pIVar16,(ImVec2 *)local_e8,&local_128,0xff000000,0xff0000ff,0xff00ffff,
                     0xff00ff00);
          local_e8._4_4_ = (ShowExampleAppCustomRendering(bool*)::sz + 10.0) * 3.0;
          local_e8._0_4_ = (ShowExampleAppCustomRendering(bool*)::sz + 10.0) * 9.8;
          Dummy((ImVec2 *)local_e8);
          EndTabItem();
          p_open = local_60;
        }
        bVar6 = BeginTabItem("Canvas",(bool *)0x0,0);
        if (bVar6) {
          if (ShowExampleAppCustomRendering(bool*)::points == '\0') {
            ShowDemoWindow();
          }
          local_e8._0_4_ = 0.0;
          local_e8._4_4_ = 0.0;
          bVar6 = Button("Clear",(ImVec2 *)local_e8);
          if ((bVar6) && (DAT_001f1b50 != (void *)0x0)) {
            _points = 0;
            MemFree(DAT_001f1b50);
            DAT_001f1b50 = (void *)0x0;
          }
          if (1 < ShowExampleAppCustomRendering(bool*)::points) {
            SameLine(0.0,-1.0);
            local_e8._0_4_ = 0.0;
            local_e8._4_4_ = 0.0;
            bVar6 = Button("Undo",(ImVec2 *)local_e8);
            if (bVar6) {
              iVar20 = ShowExampleAppCustomRendering(bool*)::points;
              if (ShowExampleAppCustomRendering(bool*)::points < 1) goto LAB_00128661;
              _points = CONCAT44(DAT_001f1b4c,ShowExampleAppCustomRendering(bool*)::points + -1);
              if (iVar20 == 1) goto LAB_00128661;
              _points = CONCAT44(DAT_001f1b4c,iVar20 + -2);
            }
          }
          Text("Left-click and drag to add lines,\nRight-click to undo");
          local_e8._0_8_ = GetCursorScreenPos();
          local_128 = GetContentRegionAvail();
          if (local_128.x < 50.0) {
            local_128.x = 50.0;
          }
          if (local_128.y < 50.0) {
            local_128.y = 50.0;
          }
          local_f0.y = (float)local_e8._4_4_ + local_128.y;
          local_f0.x = (float)local_e8._0_4_ + local_128.x;
          ImDrawList::AddRectFilledMultiColor
                    (pIVar16,(ImVec2 *)local_e8,&local_f0,0xff323232,0xff3c3232,0xff463c3c,
                     0xff3c3232);
          local_f0.y = (float)local_e8._4_4_ + local_128.y;
          local_f0.x = (float)local_e8._0_4_ + local_128.x;
          ImDrawList::AddRect(pIVar16,(ImVec2 *)local_e8,&local_f0,0xffffffff,0.0,0xf,1.0);
          InvisibleButton("canvas",&local_128);
          pIVar15 = GetIO();
          local_118._0_4_ = (pIVar15->MousePos).x - (float)local_e8._0_4_;
          pIVar15 = GetIO();
          local_f0.y = (pIVar15->MousePos).y - (float)local_e8._4_4_;
          local_f0.x = (float)local_118._0_4_;
          if (ShowExampleAppCustomRendering(bool*)::adding_line == '\x01') {
            if (ShowExampleAppCustomRendering(bool*)::points == DAT_001f1b4c) {
              if (DAT_001f1b4c == 0) {
                iVar20 = 8;
              }
              else {
                iVar20 = DAT_001f1b4c / 2 + DAT_001f1b4c;
              }
              iVar11 = ShowExampleAppCustomRendering(bool*)::points + 1;
              if (ShowExampleAppCustomRendering(bool*)::points + 1 < iVar20) {
                iVar11 = iVar20;
              }
              if (DAT_001f1b4c < iVar11) {
                pvVar14 = MemAlloc((long)iVar11 << 3);
                if (DAT_001f1b50 != (void *)0x0) {
                  memcpy(pvVar14,DAT_001f1b50,
                         (long)ShowExampleAppCustomRendering(bool*)::points << 3);
                  MemFree(DAT_001f1b50);
                }
                _points = CONCAT44(iVar11,ShowExampleAppCustomRendering(bool*)::points);
                DAT_001f1b50 = pvVar14;
              }
            }
            *(ImVec2 *)((long)DAT_001f1b50 + (long)ShowExampleAppCustomRendering(bool*)::points * 8)
                 = local_f0;
            ShowExampleAppCustomRendering(bool*)::points =
                 ShowExampleAppCustomRendering(bool*)::points + 1;
            bVar7 = IsMouseDown(0);
            bVar6 = true;
            if (!bVar7) {
              ShowExampleAppCustomRendering(bool*)::adding_line = '\0';
              goto LAB_00125e84;
            }
          }
          else {
LAB_00125e84:
            bVar6 = false;
          }
          bVar7 = IsItemHovered(0);
          if (bVar7) {
            if ((ShowExampleAppCustomRendering(bool*)::adding_line == '\0') &&
               (bVar7 = IsMouseClicked(0,false), bVar7)) {
              ImVector<ImVec2>::push_back
                        ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,&local_f0
                        );
              ShowExampleAppCustomRendering(bool*)::adding_line = '\x01';
            }
            bVar7 = IsMouseClicked(1,false);
            if ((bVar7) &&
               (iVar20 = ShowExampleAppCustomRendering(bool*)::points,
               ShowExampleAppCustomRendering(bool*)::points != 0)) {
              ShowExampleAppCustomRendering(bool*)::adding_line = '\0';
              if (ShowExampleAppCustomRendering(bool*)::points < 1) goto LAB_00128661;
              _points = CONCAT44(DAT_001f1b4c,ShowExampleAppCustomRendering(bool*)::points + -1);
              if (iVar20 == 1) goto LAB_00128661;
              _points = CONCAT44(DAT_001f1b4c,iVar20 + -2);
              bVar6 = false;
            }
          }
          IVar4.y = (float)local_e8._4_4_ + local_128.y;
          IVar4.x = (float)local_e8._0_4_ + local_128.x;
          ImDrawList::PushClipRect(pIVar16,(ImVec2)local_e8._0_8_,IVar4,true);
          uVar18 = _points & 0xffffffff;
          if (1 < ShowExampleAppCustomRendering(bool*)::points) {
            lVar22 = 0;
            do {
              if ((int)uVar18 <= lVar22) {
LAB_001284dc:
                __assert_fail("i < Size",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                              ,0x4e6,"T &ImVector<ImVec2>::operator[](int) [T = ImVec2]");
              }
              local_58.x = *(float *)((long)DAT_001f1b50 + lVar22 * 8) + (float)local_e8._0_4_;
              local_58.y = *(float *)((long)DAT_001f1b50 + lVar22 * 8 + 4) + (float)local_e8._4_4_;
              if ((long)(int)uVar18 <= lVar22 + 1) goto LAB_001284dc;
              local_50.x = (float)local_e8._0_4_ + *(float *)((long)DAT_001f1b50 + lVar22 * 8 + 8);
              local_50.y = (float)local_e8._4_4_ + *(float *)((long)DAT_001f1b50 + lVar22 * 8 + 0xc)
              ;
              ImDrawList::AddLine(pIVar16,&local_58,&local_50,0xff00ffff,2.0);
              uVar18 = (ulong)ShowExampleAppCustomRendering(bool*)::points;
              lVar22 = lVar22 + 2;
            } while (lVar22 < (long)(uVar18 - 1));
          }
          ImDrawList::PopClipRect(pIVar16);
          if (bVar6) {
            if (ShowExampleAppCustomRendering(bool*)::points < 1) {
LAB_00128661:
              __assert_fail("Size > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                            ,0x4fb,"void ImVector<ImVec2>::pop_back() [T = ImVec2]");
            }
            _points = CONCAT44(DAT_001f1b4c,ShowExampleAppCustomRendering(bool*)::points + -1);
          }
          EndTabItem();
        }
        bVar6 = BeginTabItem("BG/FG draw lists",(bool *)0x0,0);
        if (bVar6) {
          Checkbox("Draw in Background draw list",
                   (bool *)&ShowExampleAppCustomRendering(bool*)::draw_bg);
          SameLine(0.0,-1.0);
          HelpMarker("The Background draw list will be rendered below every Dear ImGui windows.");
          Checkbox("Draw in Foreground draw list",
                   (bool *)&ShowExampleAppCustomRendering(bool*)::draw_fg);
          SameLine(0.0,-1.0);
          HelpMarker("The Foreground draw list will be rendered over every Dear ImGui windows.");
          IVar4 = GetWindowPos();
          fStack_110 = (float)extraout_XMM0_Dc_00;
          local_118._0_4_ = IVar4.x;
          local_118._4_4_ = IVar4.y;
          fStack_10c = (float)extraout_XMM0_Dd_00;
          IVar4 = GetWindowSize();
          fVar29 = IVar4.y;
          uVar5 = local_118._4_4_;
          local_e8._0_4_ = IVar4.x * 0.5 + (float)local_118._0_4_;
          local_118._4_4_ = fVar29;
          local_118._0_4_ = fVar29;
          fStack_110 = fVar29;
          fStack_10c = fVar29;
          local_e8._4_4_ = fVar29 * 0.5 + (float)uVar5;
          if (ShowExampleAppCustomRendering(bool*)::draw_bg == '\x01') {
            local_108._8_4_ = extraout_XMM0_Dc_01;
            local_108._0_4_ = IVar4.x;
            local_108._4_4_ = IVar4.y;
            local_108._12_4_ = extraout_XMM0_Dd_01;
            pIVar16 = GetBackgroundDrawList();
            ImDrawList::AddCircle
                      (pIVar16,(ImVec2 *)local_e8,(float)local_108._0_4_ * 0.6,0xc80000ff,0x30,14.0)
            ;
          }
          if (ShowExampleAppCustomRendering(bool*)::draw_fg == '\x01') {
            pIVar16 = GetForegroundDrawList();
            ImDrawList::AddCircle
                      (pIVar16,(ImVec2 *)local_e8,(float)local_118._0_4_ * 0.6,0xc800ff00,0x30,10.0)
            ;
          }
          EndTabItem();
        }
        EndTabBar();
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_metrics == true) {
    ShowMetricsWindow(&ShowDemoWindow::show_app_metrics);
  }
  if (ShowDemoWindow::show_app_style_editor == true) {
    Begin("Style Editor",&ShowDemoWindow::show_app_style_editor,0);
    ShowStyleEditor((ImGuiStyle *)0x0);
    End();
  }
  if (ShowDemoWindow::show_app_about == true) {
    ShowAboutWindow(&ShowDemoWindow::show_app_about);
  }
  uVar9 = ShowDemoWindow::no_titlebar + 8;
  if (ShowDemoWindow::no_scrollbar == false) {
    uVar9 = (uint)ShowDemoWindow::no_titlebar;
  }
  uVar26 = uVar9 + 0x400;
  if (ShowDemoWindow::no_menu != false) {
    uVar26 = uVar9;
  }
  uVar9 = uVar26 + 4;
  if (ShowDemoWindow::no_move == false) {
    uVar9 = uVar26;
  }
  uVar26 = uVar9 | 2;
  if (ShowDemoWindow::no_resize == false) {
    uVar26 = uVar9;
  }
  uVar9 = uVar26 | 0x20;
  if (ShowDemoWindow::no_collapse == false) {
    uVar9 = uVar26;
  }
  uVar26 = uVar9 | 0xc0000;
  if (ShowDemoWindow::no_nav == false) {
    uVar26 = uVar9;
  }
  uVar9 = uVar26 | 0x80;
  if (ShowDemoWindow::no_background == false) {
    uVar9 = uVar26;
  }
  uVar26 = uVar9 | 0x2000;
  if (ShowDemoWindow::no_bring_to_front == false) {
    uVar26 = uVar9;
  }
  if (ShowDemoWindow::no_close != false) {
    p_open = (bool *)0x0;
  }
  local_e8._0_4_ = 650.0;
  local_e8._4_4_ = 20.0;
  local_128.x = 0.0;
  local_128.y = 0.0;
  SetNextWindowPos((ImVec2 *)local_e8,4,&local_128);
  local_e8._0_4_ = 550.0;
  local_e8._4_4_ = 680.0;
  SetNextWindowSize((ImVec2 *)local_e8,4);
  bVar6 = Begin("Dear ImGui Demo",p_open,uVar26);
  if (bVar6) {
    fVar29 = GetFontSize();
    PushItemWidth(fVar29 * -12.0);
    bVar6 = BeginMenuBar();
    if (bVar6) {
      bVar6 = BeginMenu("Menu",true);
      if (bVar6) {
        ShowExampleMenuFile();
        EndMenu();
      }
      bVar6 = BeginMenu("Examples",true);
      if (bVar6) {
        MenuItem("Main menu bar",(char *)0x0,&ShowDemoWindow::show_app_main_menu_bar,true);
        MenuItem("Console",(char *)0x0,&ShowDemoWindow::show_app_console,true);
        MenuItem("Log",(char *)0x0,&ShowDemoWindow::show_app_log,true);
        MenuItem("Simple layout",(char *)0x0,&ShowDemoWindow::show_app_layout,true);
        MenuItem("Property editor",(char *)0x0,&ShowDemoWindow::show_app_property_editor,true);
        MenuItem("Long text display",(char *)0x0,&ShowDemoWindow::show_app_long_text,true);
        MenuItem("Auto-resizing window",(char *)0x0,&ShowDemoWindow::show_app_auto_resize,true);
        MenuItem("Constrained-resizing window",(char *)0x0,
                 &ShowDemoWindow::show_app_constrained_resize,true);
        MenuItem("Simple overlay",(char *)0x0,&ShowDemoWindow::show_app_simple_overlay,true);
        MenuItem("Manipulating window titles",(char *)0x0,&ShowDemoWindow::show_app_window_titles,
                 true);
        MenuItem("Custom rendering",(char *)0x0,&ShowDemoWindow::show_app_custom_rendering,true);
        MenuItem("Documents",(char *)0x0,&ShowDemoWindow::show_app_documents,true);
        EndMenu();
      }
      bVar6 = BeginMenu("Tools",true);
      if (bVar6) {
        MenuItem("Metrics",(char *)0x0,&ShowDemoWindow::show_app_metrics,true);
        MenuItem("Style Editor",(char *)0x0,&ShowDemoWindow::show_app_style_editor,true);
        MenuItem("About Dear ImGui",(char *)0x0,&ShowDemoWindow::show_app_about,true);
        EndMenu();
      }
      EndMenuBar();
    }
    Text("dear imgui says hello. (%s)");
    Spacing();
    bVar6 = CollapsingHeader("Help",0);
    if (bVar6) {
      Text("PROGRAMMER GUIDE:");
      BulletText("Please see the ShowDemoWindow() code in imgui_demo.cpp. <- you are here!");
      BulletText("Please see the comments in imgui.cpp.");
      BulletText("Please see the examples/ application.");
      BulletText("Enable \'io.ConfigFlags |= NavEnableKeyboard\' for keyboard controls.");
      BulletText("Enable \'io.ConfigFlags |= NavEnableGamepad\' for gamepad controls.");
      Separator();
      Text("USER GUIDE:");
      ShowUserGuide();
    }
    bVar6 = CollapsingHeader("Configuration",0);
    if (bVar6) {
      pIVar15 = GetIO();
      bVar6 = TreeNode("Configuration##2");
      if (bVar6) {
        CheckboxFlags("io.ConfigFlags: NavEnableKeyboard",(uint *)pIVar15,1);
        CheckboxFlags("io.ConfigFlags: NavEnableGamepad",(uint *)pIVar15,2);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Required back-end to feed in gamepad inputs in io.NavInputs[] and set io.BackendFlags |= ImGuiBackendFlags_HasGamepad.\n\nRead instructions in imgui.cpp for details."
                  );
        CheckboxFlags("io.ConfigFlags: NavEnableSetMousePos",(uint *)pIVar15,4);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Instruct navigation to move the mouse cursor. See comment for ImGuiConfigFlags_NavEnableSetMousePos."
                  );
        CheckboxFlags("io.ConfigFlags: NoMouse",(uint *)pIVar15,0x10);
        if ((pIVar15->ConfigFlags & 0x10) != 0) {
          dVar3 = GetTime();
          fVar29 = fmodf((float)dVar3,0.4);
          if (fVar29 < 0.2) {
            SameLine(0.0,-1.0);
            Text("<<PRESS SPACE TO DISABLE>>");
          }
          iVar20 = GetKeyIndex(0xc);
          bVar6 = IsKeyPressed(iVar20,true);
          if (bVar6) {
            *(byte *)&pIVar15->ConfigFlags = (byte)pIVar15->ConfigFlags & 0xef;
          }
        }
        CheckboxFlags("io.ConfigFlags: NoMouseCursorChange",(uint *)pIVar15,0x20);
        SameLine(0.0,-1.0);
        HelpMarker("Instruct back-end to not alter mouse cursor shape and visibility.");
        Checkbox("io.ConfigInputTextCursorBlink",&pIVar15->ConfigInputTextCursorBlink);
        SameLine(0.0,-1.0);
        HelpMarker("Set to false to disable blinking cursor, for users who consider it distracting")
        ;
        Checkbox("io.ConfigWindowsResizeFromEdges",&pIVar15->ConfigWindowsResizeFromEdges);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable resizing of windows from their edges and from the lower-left corner.\nThis requires (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors) because it needs mouse cursor feedback."
                  );
        Checkbox("io.ConfigWindowsMoveFromTitleBarOnly",&pIVar15->ConfigWindowsMoveFromTitleBarOnly)
        ;
        Checkbox("io.MouseDrawCursor",&pIVar15->MouseDrawCursor);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Instruct Dear ImGui to render a mouse cursor for you. Note that a mouse cursor rendered via your application GPU rendering path will feel more laggy than hardware cursor, but will be more in sync with your other visuals.\n\nSome desktop applications may use both kinds of cursors (e.g. enable software cursor only when resizing/dragging something)."
                  );
        TreePop();
        Separator();
      }
      bVar6 = TreeNode("Backend Flags");
      if (bVar6) {
        HelpMarker(
                  "Those flags are set by the back-ends (imgui_impl_xxx files) to specify their capabilities."
                  );
        local_e8._0_4_ = pIVar15->BackendFlags;
        CheckboxFlags("io.BackendFlags: HasGamepad",(uint *)local_e8,1);
        CheckboxFlags("io.BackendFlags: HasMouseCursors",(uint *)local_e8,2);
        CheckboxFlags("io.BackendFlags: HasSetMousePos",(uint *)local_e8,4);
        CheckboxFlags("io.BackendFlags: RendererHasVtxOffset",(uint *)local_e8,8);
        TreePop();
        Separator();
      }
      bVar6 = TreeNode("Style");
      if (bVar6) {
        ShowStyleEditor((ImGuiStyle *)0x0);
        TreePop();
        Separator();
      }
      bVar6 = TreeNode("Capture/Logging");
      if (bVar6) {
        TextWrapped(
                   "The logging API redirects all text output so you can easily capture the content of a window or a block. Tree nodes can be automatically expanded."
                   );
        HelpMarker(
                  "Try opening any of the contents below in this window and then click one of the \"Log To\" button."
                  );
        LogButtons();
        TextWrapped(
                   "You can also call ImGui::LogText() to output directly to the log without a visual output."
                   );
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar6 = Button("Copy \"Hello, world!\" to clipboard",(ImVec2 *)local_e8);
        if (bVar6) {
          LogToClipboard(-1);
          LogText("Hello, world!");
          LogFinish();
        }
        TreePop();
      }
    }
    bVar6 = CollapsingHeader("Window options",0);
    if (bVar6) {
      Checkbox("No titlebar",&ShowDemoWindow::no_titlebar);
      SameLine(150.0,-1.0);
      Checkbox("No scrollbar",&ShowDemoWindow::no_scrollbar);
      SameLine(300.0,-1.0);
      Checkbox("No menu",&ShowDemoWindow::no_menu);
      Checkbox("No move",&ShowDemoWindow::no_move);
      SameLine(150.0,-1.0);
      Checkbox("No resize",&ShowDemoWindow::no_resize);
      SameLine(300.0,-1.0);
      Checkbox("No collapse",&ShowDemoWindow::no_collapse);
      Checkbox("No close",&ShowDemoWindow::no_close);
      SameLine(150.0,-1.0);
      Checkbox("No nav",&ShowDemoWindow::no_nav);
      SameLine(300.0,-1.0);
      Checkbox("No background",&ShowDemoWindow::no_background);
      Checkbox("No bring to front",&ShowDemoWindow::no_bring_to_front);
    }
    ShowDemoWindowWidgets();
    ShowDemoWindowLayout();
    bVar6 = CollapsingHeader("Popups & Modal windows",0);
    if (bVar6) {
      bVar6 = TreeNode("Popups");
      if (bVar6) {
        TextWrapped(
                   "When a popup is active, it inhibits interacting with windows that are behind the popup. Clicking outside the popup closes it."
                   );
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar6 = Button("Select..",(ImVec2 *)local_e8);
        if (bVar6) {
          OpenPopup("my_select_popup");
        }
        SameLine(0.0,-1.0);
        if ((long)ShowDemoWindowPopups()::selected_fish == -1) {
          pcVar24 = "<None>";
        }
        else {
          pcVar24 = (&PTR_anon_var_dwarf_37156_001eaa00)[ShowDemoWindowPopups()::selected_fish];
        }
        TextUnformatted(pcVar24,(char *)0x0);
        bVar6 = BeginPopup("my_select_popup",0);
        if (bVar6) {
          lVar22 = 0;
          Text("Aquarium");
          Separator();
          ppuVar28 = &PTR_anon_var_dwarf_37156_001eaa00;
          do {
            local_e8._0_4_ = 0.0;
            local_e8._4_4_ = 0.0;
            bVar6 = Selectable(*ppuVar28,false,0,(ImVec2 *)local_e8);
            if (bVar6) {
              ShowDemoWindowPopups()::selected_fish = (int)lVar22;
            }
            lVar22 = lVar22 + 1;
            ppuVar28 = ppuVar28 + 1;
          } while (lVar22 != 5);
          EndPopup();
        }
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar6 = Button("Toggle..",(ImVec2 *)local_e8);
        if (bVar6) {
          OpenPopup("my_toggle_popup");
        }
        bVar6 = BeginPopup("my_toggle_popup",0);
        if (bVar6) {
          pbVar21 = (bool *)&ShowDemoWindowPopups()::toggles;
          lVar22 = 0;
          do {
            MenuItem(*(char **)((long)&PTR_anon_var_dwarf_37156_001eaa00 + lVar22),"",pbVar21,true);
            lVar22 = lVar22 + 8;
            pbVar21 = pbVar21 + 1;
          } while (lVar22 != 0x28);
          bVar6 = BeginMenu("Sub-menu",true);
          if (bVar6) {
            MenuItem("Click me",(char *)0x0,false,true);
            EndMenu();
          }
          Separator();
          Text("Tooltip here");
          bVar6 = IsItemHovered(0);
          if (bVar6) {
            SetTooltip("I am a tooltip over a popup");
          }
          local_e8._0_4_ = 0.0;
          local_e8._4_4_ = 0.0;
          bVar6 = Button("Stacked Popup",(ImVec2 *)local_e8);
          if (bVar6) {
            OpenPopup("another popup");
          }
          bVar6 = BeginPopup("another popup",0);
          if (bVar6) {
            pbVar21 = (bool *)&ShowDemoWindowPopups()::toggles;
            lVar22 = 0;
            do {
              MenuItem(*(char **)((long)&PTR_anon_var_dwarf_37156_001eaa00 + lVar22),"",pbVar21,true
                      );
              lVar22 = lVar22 + 8;
              pbVar21 = pbVar21 + 1;
            } while (lVar22 != 0x28);
            bVar6 = BeginMenu("Sub-menu",true);
            if (bVar6) {
              MenuItem("Click me",(char *)0x0,false,true);
              local_e8._0_4_ = 0.0;
              local_e8._4_4_ = 0.0;
              bVar6 = Button("Stacked Popup",(ImVec2 *)local_e8);
              if (bVar6) {
                OpenPopup("another popup");
              }
              bVar6 = BeginPopup("another popup",0);
              if (bVar6) {
                Text("I am the last one here.");
                EndPopup();
              }
              EndMenu();
            }
            EndPopup();
          }
          EndPopup();
        }
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar6 = Button("File Menu..",(ImVec2 *)local_e8);
        if (bVar6) {
          OpenPopup("my_file_popup");
        }
        bVar6 = BeginPopup("my_file_popup",0);
        if (bVar6) {
          ShowExampleMenuFile();
          EndPopup();
        }
        TreePop();
      }
      bVar6 = TreeNode("Context menus");
      if (bVar6) {
        Text("Value = %.3f (<-- right-click here)",SUB84((double)ShowDemoWindowPopups()::value,0));
        bVar6 = BeginPopupContextItem("item context menu",1);
        if (bVar6) {
          local_e8._0_4_ = 0.0;
          local_e8._4_4_ = 0.0;
          bVar6 = Selectable("Set to zero",false,0,(ImVec2 *)local_e8);
          if (bVar6) {
            ShowDemoWindowPopups()::value = 0.0;
          }
          local_e8._0_4_ = 0.0;
          local_e8._4_4_ = 0.0;
          bVar6 = Selectable("Set to PI",false,0,(ImVec2 *)local_e8);
          if (bVar6) {
            ShowDemoWindowPopups()::value = 3.1415;
          }
          SetNextItemWidth(-1.0);
          DragFloat("##Value",&ShowDemoWindowPopups()::value,0.1,0.0,0.0,"%.3f",1.0);
          EndPopup();
        }
        Text("(You can also right-click me to open the same popup as above.)");
        OpenPopupOnItemClick("item context menu",1);
        sprintf(local_e8,"Button: %s###Button",ShowDemoWindowPopups()::name);
        local_128.x = 0.0;
        local_128.y = 0.0;
        Button(local_e8,&local_128);
        bVar6 = BeginPopupContextItem((char *)0x0,1);
        if (bVar6) {
          Text("Edit name:");
          InputText("##edit",ShowDemoWindowPopups()::name,0x20,0,(ImGuiInputTextCallback)0x0,
                    (void *)0x0);
          local_128.x = 0.0;
          local_128.y = 0.0;
          bVar6 = Button("Close",&local_128);
          if (bVar6) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        SameLine(0.0,-1.0);
        Text("(<-- right-click here)");
        TreePop();
      }
      bVar6 = TreeNode("Modals");
      if (bVar6) {
        TextWrapped(
                   "Modal windows are like popups but the user cannot close them by clicking outside the window."
                   );
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar6 = Button("Delete..",(ImVec2 *)local_e8);
        if (bVar6) {
          OpenPopup("Delete?");
        }
        bVar6 = BeginPopupModal("Delete?",(bool *)0x0,0x40);
        if (bVar6) {
          Text("All those beautiful files will be deleted.\nThis operation cannot be undone!\n\n");
          Separator();
          local_e8._0_4_ = 0.0;
          local_e8._4_4_ = 0.0;
          PushStyleVar(10,(ImVec2 *)local_e8);
          Checkbox("Don\'t ask me next time",(bool *)&ShowDemoWindowPopups()::dont_ask_me_next_time)
          ;
          PopStyleVar(1);
          local_e8._0_4_ = 120.0;
          local_e8._4_4_ = 0.0;
          bVar6 = Button("OK",(ImVec2 *)local_e8);
          if (bVar6) {
            CloseCurrentPopup();
          }
          SetItemDefaultFocus();
          SameLine(0.0,-1.0);
          local_e8._0_4_ = 120.0;
          local_e8._4_4_ = 0.0;
          bVar6 = Button("Cancel",(ImVec2 *)local_e8);
          if (bVar6) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar6 = Button("Stacked modals..",(ImVec2 *)local_e8);
        if (bVar6) {
          OpenPopup("Stacked 1");
        }
        bVar6 = BeginPopupModal("Stacked 1",(bool *)0x0,0x400);
        if (bVar6) {
          bVar6 = BeginMenuBar();
          if (bVar6) {
            bVar6 = BeginMenu("File",true);
            if (bVar6) {
              MenuItem("Dummy menu item",(char *)0x0,false,true);
              EndMenu();
            }
            EndMenuBar();
          }
          Text(
              "Hello from Stacked The First\nUsing style.Colors[ImGuiCol_ModalWindowDimBg] behind it."
              );
          Combo("Combo",&ShowDemoWindowPopups()::item,"aaaa",-1);
          ColorEdit4("color",(float *)ShowDemoWindowPopups()::color,0);
          local_e8._0_4_ = 0.0;
          local_e8._4_4_ = 0.0;
          bVar6 = Button("Add another modal..",(ImVec2 *)local_e8);
          if (bVar6) {
            OpenPopup("Stacked 2");
          }
          local_128.x._0_1_ = 1;
          bVar6 = BeginPopupModal("Stacked 2",(bool *)&local_128,0);
          if (bVar6) {
            Text("Hello from Stacked The Second!");
            local_e8._0_4_ = 0.0;
            local_e8._4_4_ = 0.0;
            bVar6 = Button("Close",(ImVec2 *)local_e8);
            if (bVar6) {
              CloseCurrentPopup();
            }
            EndPopup();
          }
          local_e8._0_4_ = 0.0;
          local_e8._4_4_ = 0.0;
          bVar6 = Button("Close",(ImVec2 *)local_e8);
          if (bVar6) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        TreePop();
      }
      bVar6 = TreeNode("Menus inside a regular window");
      if (bVar6) {
        TextWrapped(
                   "Below we are testing adding menu items to a regular window. It\'s rather unusual but should work!"
                   );
        Separator();
        PushID("foo");
        MenuItem("Menu item","CTRL+M",false,true);
        bVar6 = BeginMenu("Menu inside a regular window",true);
        if (bVar6) {
          ShowExampleMenuFile();
          EndMenu();
        }
        PopID();
        Separator();
        TreePop();
      }
    }
    bVar6 = CollapsingHeader("Columns",0);
    if (bVar6) {
      PushID("Columns");
      Checkbox("Disable tree indentation",(bool *)&ShowDemoWindowColumns()::disable_indent);
      SameLine(0.0,-1.0);
      HelpMarker(
                "Disable the indenting of tree nodes so demo columns can use the full window width."
                );
      if (ShowDemoWindowColumns()::disable_indent == '\x01') {
        PushStyleVar(0xf,0.0);
      }
      bVar6 = TreeNode("Basic");
      if (bVar6) {
        Text("Without border:");
        Columns(3,"mycolumns3",false);
        Separator();
        uVar18 = 0;
        do {
          sprintf(local_e8,"Item %d",uVar18);
          local_128.x = 0.0;
          local_128.y = 0.0;
          Selectable(local_e8,false,0,&local_128);
          NextColumn();
          uVar9 = (int)uVar18 + 1;
          uVar18 = (ulong)uVar9;
        } while (uVar9 != 0xe);
        Columns(1,(char *)0x0,true);
        Separator();
        Text("With border:");
        Columns(4,"mycolumns",true);
        Separator();
        Text("ID");
        NextColumn();
        Text("Name");
        NextColumn();
        Text("Path");
        NextColumn();
        Text("Hovered");
        NextColumn();
        Separator();
        lVar22 = 0;
        uVar18 = 0;
        do {
          sprintf(local_e8,"%04d",uVar18 & 0xffffffff);
          local_128.x = 0.0;
          local_128.y = 0.0;
          bVar6 = Selectable(local_e8,uVar18 == ShowDemoWindowColumns()::selected,2,&local_128);
          if (bVar6) {
            ShowDemoWindowColumns()::selected = (uint)uVar18;
          }
          IsItemHovered(0);
          NextColumn();
          Text((char *)((long)&DAT_001a037c + (long)*(int *)((long)&DAT_001a037c + lVar22)));
          NextColumn();
          Text((char *)((long)&DAT_001a0388 + (long)*(int *)((long)&DAT_001a0388 + lVar22)));
          NextColumn();
          Text("%d");
          NextColumn();
          uVar18 = uVar18 + 1;
          lVar22 = lVar22 + 4;
        } while (lVar22 != 0xc);
        Columns(1,(char *)0x0,true);
        Separator();
        TreePop();
      }
      bVar6 = TreeNode("Borders");
      if (bVar6) {
        fVar29 = GetFontSize();
        SetNextItemWidth(fVar29 * 8.0);
        DragInt("##columns_count",&ShowDemoWindowColumns()::columns_count,0.1,2,10,"%d columns");
        if (ShowDemoWindowColumns()::columns_count < 2) {
          ShowDemoWindowColumns()::columns_count = 2;
        }
        SameLine(0.0,-1.0);
        Checkbox("horizontal",(bool *)&ShowDemoWindowColumns()::h_borders);
        SameLine(0.0,-1.0);
        Checkbox("vertical",(bool *)&ShowDemoWindowColumns()::v_borders);
        Columns(ShowDemoWindowColumns()::columns_count,(char *)0x0,
                (bool)ShowDemoWindowColumns()::v_borders);
        if (0 < ShowDemoWindowColumns()::columns_count) {
          iVar20 = 0;
          do {
            if ((ShowDemoWindowColumns()::h_borders == '\x01') &&
               (iVar11 = GetColumnIndex(), iVar11 == 0)) {
              Separator();
            }
            Text("%c%c%c",(ulong)(iVar20 + 0x61U),(ulong)(iVar20 + 0x61U));
            fVar29 = GetColumnWidth(-1);
            Text("Width %.2f",SUB84((double)fVar29,0));
            IVar4 = GetContentRegionAvail();
            Text("Avail %.2f",SUB84((double)IVar4.x,0));
            fVar29 = GetColumnOffset(-1);
            Text("Offset %.2f",SUB84((double)fVar29,0));
            Text("Long text that is likely to clip");
            local_e8._0_4_ = -1.1754944e-38;
            local_e8._4_4_ = 0.0;
            Button("Button",(ImVec2 *)local_e8);
            NextColumn();
            iVar20 = iVar20 + 1;
          } while (SBORROW4(iVar20,ShowDemoWindowColumns()::columns_count * 3) !=
                   iVar20 + ShowDemoWindowColumns()::columns_count * -3 < 0);
        }
        Columns(1,(char *)0x0,true);
        if (ShowDemoWindowColumns()::h_borders != '\0') {
          Separator();
        }
        TreePop();
      }
      bVar6 = TreeNode("Mixed items");
      if (bVar6) {
        Columns(3,"mixed",true);
        Separator();
        Text("Hello");
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        Button("Banana",(ImVec2 *)local_e8);
        NextColumn();
        Text("ImGui");
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        Button("Apple",(ImVec2 *)local_e8);
        InputFloat("red",(float *)&ShowDemoWindowColumns()::foo,0.05,0.0,"%.3f",0);
        Text("An extra line here.");
        NextColumn();
        Text("Sailor");
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        Button("Corniflower",(ImVec2 *)local_e8);
        InputFloat("blue",(float *)&ShowDemoWindowColumns()::bar,0.05,0.0,"%.3f",0);
        NextColumn();
        bVar6 = CollapsingHeader("Category A",0);
        if (bVar6) {
          Text("Blah blah blah");
        }
        NextColumn();
        bVar6 = CollapsingHeader("Category B",0);
        if (bVar6) {
          Text("Blah blah blah");
        }
        NextColumn();
        bVar6 = CollapsingHeader("Category C",0);
        if (bVar6) {
          Text("Blah blah blah");
        }
        NextColumn();
        Columns(1,(char *)0x0,true);
        Separator();
        TreePop();
      }
      bVar6 = TreeNode("Word-wrapping");
      if (bVar6) {
        Columns(2,"word-wrapping",true);
        Separator();
        TextWrapped("The quick brown fox jumps over the lazy dog.");
        TextWrapped("Hello Left");
        NextColumn();
        TextWrapped("The quick brown fox jumps over the lazy dog.");
        TextWrapped("Hello Right");
        Columns(1,(char *)0x0,true);
        Separator();
        TreePop();
      }
      bVar6 = TreeNode("Horizontal Scrolling");
      if (bVar6) {
        local_e8._0_4_ = 1500.0;
        local_e8._4_4_ = 0.0;
        SetNextWindowContentSize((ImVec2 *)local_e8);
        fVar29 = GetFontSize();
        local_e8._0_8_ = (ulong)(uint)(fVar29 * 20.0) << 0x20;
        BeginChild("##ScrollingRegion",(ImVec2 *)local_e8,false,0x800);
        Columns(10,(char *)0x0,true);
        ImGuiListClipper::Begin((ImGuiListClipper *)local_e8,2000,-1.0);
        while (bVar6 = ImGuiListClipper::Step((ImGuiListClipper *)local_e8), bVar6) {
          uVar9 = (uint)local_d8;
          while( true ) {
            if (local_d8._4_4_ <= (int)uVar9) break;
            uVar18 = 0;
            do {
              Text("Line %d Column %d...",(ulong)uVar9,uVar18);
              NextColumn();
              uVar26 = (int)uVar18 + 1;
              uVar18 = (ulong)uVar26;
            } while (uVar26 != 10);
            uVar9 = uVar9 + 1;
          }
        }
        Columns(1,(char *)0x0,true);
        EndChild();
        TreePop();
        if ((float)local_e8._8_4_ != -NAN) {
LAB_00128723:
          __assert_fail("ItemsCount == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                        ,0x6b8,"ImGuiListClipper::~ImGuiListClipper()");
        }
      }
      bVar6 = TreeNode("Tree");
      if (bVar6) {
        Columns(2,"tree",true);
        pvVar14 = (void *)0x0;
        do {
          bVar6 = TreeNode(pvVar14,"Node%d",(ulong)pvVar14 & 0xffffffff);
          NextColumn();
          Text("Node contents");
          NextColumn();
          if (bVar6) {
            ptr_id = (void *)0x0;
            do {
              bVar6 = TreeNode(ptr_id,"Node%d.%d",(ulong)pvVar14 & 0xffffffff);
              NextColumn();
              Text("Node contents");
              if (bVar6) {
                Text("Even more contents");
                bVar7 = TreeNode("Tree in column");
                if (bVar7) {
                  Text("The quick brown fox jumps over the lazy dog");
                  TreePop();
                }
                NextColumn();
                if (bVar6) {
                  TreePop();
                }
              }
              else {
                NextColumn();
              }
              ptr_id = (void *)((long)ptr_id + 1);
            } while (ptr_id != (void *)0x3);
            TreePop();
          }
          pvVar14 = (void *)((long)pvVar14 + 1);
        } while (pvVar14 != (void *)0x3);
        Columns(1,(char *)0x0,true);
        TreePop();
      }
      if (ShowDemoWindowColumns()::disable_indent == '\x01') {
        PopStyleVar(1);
      }
      PopID();
    }
    bVar6 = CollapsingHeader("Filtering",0);
    if (bVar6) {
      if ((ShowDemoWindowMisc()::filter == '\0') &&
         (iVar20 = __cxa_guard_acquire(&ShowDemoWindowMisc()::filter), iVar20 != 0)) {
        ImGuiTextFilter::ImGuiTextFilter((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,"");
        __cxa_atexit(ImGuiTextFilter::~ImGuiTextFilter,ShowDemoWindowMisc()::filter,&__dso_handle);
        __cxa_guard_release(&ShowDemoWindowMisc()::filter);
      }
      Text(
          "Filter usage:\n  \"\"         display all lines\n  \"xxx\"      display lines containing \"xxx\"\n  \"xxx,yyy\"  display lines containing \"xxx\" or \"yyy\"\n  \"-xxx\"     hide lines containing \"xxx\""
          );
      ImGuiTextFilter::Draw((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,"Filter (inc,-exc)",0.0)
      ;
      lVar22 = 0;
      do {
        bVar6 = ImGuiTextFilter::PassFilter
                          ((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,
                           *(char **)((long)&PTR_anon_var_dwarf_3776c_001eaa30 + lVar22),(char *)0x0
                          );
        if (bVar6) {
          BulletText("%s");
        }
        lVar22 = lVar22 + 8;
      } while (lVar22 != 0x40);
    }
    bVar6 = CollapsingHeader("Inputs, Navigation & Focus",0);
    if (bVar6) {
      pIVar15 = GetIO();
      Text("WantCaptureMouse: %d",(ulong)pIVar15->WantCaptureMouse);
      Text("WantCaptureKeyboard: %d",(ulong)pIVar15->WantCaptureKeyboard);
      Text("WantTextInput: %d",(ulong)pIVar15->WantTextInput);
      Text("WantSetMousePos: %d",(ulong)pIVar15->WantSetMousePos);
      Text("NavActive: %d, NavVisible: %d",(ulong)pIVar15->NavActive,(ulong)pIVar15->NavVisible);
      bVar6 = TreeNode("Keyboard, Mouse & Navigation State");
      if (bVar6) {
        bVar6 = IsMousePosValid((ImVec2 *)0x0);
        if (bVar6) {
          Text("Mouse pos: (%g, %g)",SUB84((double)(pIVar15->MousePos).x,0),
               SUB84((double)(pIVar15->MousePos).y,0));
        }
        else {
          Text("Mouse pos: <INVALID>");
        }
        Text("Mouse delta: (%g, %g)",SUB84((double)(pIVar15->MouseDelta).x,0));
        lVar22 = 0;
        Text("Mouse down:");
        do {
          if (0.0 <= pIVar15->MouseDownDuration[lVar22]) {
            SameLine(0.0,-1.0);
            Text("b%d (%.02f secs)",SUB84((double)pIVar15->MouseDownDuration[lVar22],0));
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != 5);
        Text("Mouse clicked:");
        iVar20 = 0;
        do {
          bVar6 = IsMouseClicked(iVar20,false);
          if (bVar6) {
            SameLine(0.0,-1.0);
            Text("b%d");
          }
          iVar20 = iVar20 + 1;
        } while (iVar20 != 5);
        Text("Mouse dbl-clicked:");
        uVar9 = 0;
        do {
          bVar6 = IsMouseDoubleClicked(uVar9);
          if (bVar6) {
            SameLine(0.0,-1.0);
            Text("b%d",(ulong)uVar9);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != 5);
        Text("Mouse released:");
        uVar9 = 0;
        do {
          bVar6 = IsMouseReleased(uVar9);
          if (bVar6) {
            SameLine(0.0,-1.0);
            Text("b%d",(ulong)uVar9);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != 5);
        Text("Mouse wheel: %.1f",SUB84((double)pIVar15->MouseWheel,0));
        uVar18 = 0;
        Text("Keys down:");
        do {
          if (0.0 <= pIVar15->KeysDownDuration[uVar18]) {
            SameLine(0.0,-1.0);
            Text("%d (0x%X) (%.02f secs)",SUB84((double)pIVar15->KeysDownDuration[uVar18],0),
                 uVar18 & 0xffffffff,uVar18 & 0xffffffff);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != 0x200);
        Text("Keys pressed:");
        uVar9 = 0;
        do {
          bVar6 = IsKeyPressed(uVar9,true);
          if (bVar6) {
            SameLine(0.0,-1.0);
            Text("%d (0x%X)",(ulong)uVar9,(ulong)uVar9);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != 0x200);
        Text("Keys release:");
        uVar18 = 0;
        do {
          bVar6 = IsKeyReleased((int)uVar18);
          if (bVar6) {
            SameLine(0.0,-1.0);
            Text("%d (0x%X)",uVar18,uVar18);
          }
          uVar9 = (int)uVar18 + 1;
          uVar18 = (ulong)uVar9;
        } while (uVar9 != 0x200);
        pcVar24 = "CTRL ";
        if (pIVar15->KeyCtrl == false) {
          pcVar24 = "";
        }
        pcVar23 = "SHIFT ";
        if (pIVar15->KeyShift == false) {
          pcVar23 = "";
        }
        Text("Keys mods: %s%s%s%s",pcVar24,pcVar23);
        Text("Chars queue:");
        if (0 < (pIVar15->InputQueueCharacters).Size) {
          lVar22 = 0;
          do {
            uVar2 = (pIVar15->InputQueueCharacters).Data[lVar22];
            SameLine(0.0,-1.0);
            uVar9 = (int)(char)uVar2;
            if (0xde < (ushort)(uVar2 - 0x21)) {
              uVar9 = 0x3f;
            }
            Text("\'%c\' (0x%04X)",(ulong)uVar9,(ulong)uVar2);
            lVar22 = lVar22 + 1;
          } while (lVar22 < (pIVar15->InputQueueCharacters).Size);
        }
        uVar18 = 0;
        Text("NavInputs down:");
        do {
          if (0.0 < pIVar15->NavInputs[uVar18]) {
            SameLine(0.0,-1.0);
            Text("[%d] %.2f",SUB84((double)pIVar15->NavInputs[uVar18],0),uVar18 & 0xffffffff);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != 0x15);
        Text("NavInputs pressed:");
        uVar18 = 0;
        do {
          if ((pIVar15->NavInputsDownDuration[uVar18] == 0.0) &&
             (!NAN(pIVar15->NavInputsDownDuration[uVar18]))) {
            SameLine(0.0,-1.0);
            Text("[%d]",uVar18 & 0xffffffff);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != 0x15);
        uVar18 = 0;
        Text("NavInputs duration:");
        do {
          if (0.0 <= pIVar15->NavInputsDownDuration[uVar18]) {
            SameLine(0.0,-1.0);
            Text("[%d] %.2f",SUB84((double)pIVar15->NavInputsDownDuration[uVar18],0),
                 uVar18 & 0xffffffff);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != 0x15);
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        Button("Hovering me sets the\nkeyboard capture flag",(ImVec2 *)local_e8);
        bVar6 = IsItemHovered(0);
        if (bVar6) {
          CaptureKeyboardFromApp(true);
        }
        SameLine(0.0,-1.0);
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        Button("Holding me clears the\nthe keyboard capture flag",(ImVec2 *)local_e8);
        bVar6 = IsItemActive();
        if (bVar6) {
          CaptureKeyboardFromApp(false);
        }
        TreePop();
      }
      bVar6 = TreeNode("Tabbing");
      if (bVar6) {
        Text("Use TAB/SHIFT+TAB to cycle through keyboard editable fields.");
        InputText("1",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        InputText("2",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        InputText("3",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        PushAllowKeyboardFocus(false);
        InputText("4 (tab skip)",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,
                  (void *)0x0);
        PopAllowKeyboardFocus();
        InputText("5",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        TreePop();
      }
      bVar6 = TreeNode("Focus from code");
      if (bVar6) {
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar6 = Button("Focus on 1",(ImVec2 *)local_e8);
        SameLine(0.0,-1.0);
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar7 = Button("Focus on 2",(ImVec2 *)local_e8);
        SameLine(0.0,-1.0);
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar8 = Button("Focus on 3",(ImVec2 *)local_e8);
        if (bVar6) {
          SetKeyboardFocusHere(0);
        }
        InputText("1",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        bVar6 = IsItemActive();
        uVar9 = (uint)bVar6;
        if (bVar7) {
          SetKeyboardFocusHere(0);
        }
        InputText("2",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        bVar6 = IsItemActive();
        if (bVar6) {
          uVar9 = 2;
        }
        PushAllowKeyboardFocus(false);
        if (bVar8) {
          SetKeyboardFocusHere(0);
        }
        InputText("3 (tab skip)",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,
                  (void *)0x0);
        bVar6 = IsItemActive();
        if (bVar6) {
          uVar9 = 3;
        }
        PopAllowKeyboardFocus();
        if (uVar9 == 0) {
          Text("Item with focus: <none>");
        }
        else {
          Text("Item with focus: %d",(ulong)uVar9);
        }
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar6 = Button("Focus on X",(ImVec2 *)local_e8);
        SameLine(0.0,-1.0);
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar7 = Button("Focus on Y",(ImVec2 *)local_e8);
        iVar20 = 1;
        if (!bVar7) {
          iVar20 = bVar6 - 1;
        }
        SameLine(0.0,-1.0);
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        bVar6 = Button("Focus on Z",(ImVec2 *)local_e8);
        iVar11 = 2;
        if (!bVar6) {
          iVar11 = iVar20;
        }
        if (iVar11 != -1) {
          SetKeyboardFocusHere(iVar11);
        }
        SliderFloat3("Float3",(float *)ShowDemoWindowMisc()::f3,0.0,1.0,"%.3f",1.0);
        TextWrapped("NB: Cursor & selection are preserved when refocusing last used item in code.");
        TreePop();
      }
      bVar6 = TreeNode("Dragging");
      if (bVar6) {
        TextWrapped(
                   "You can use ImGui::GetMouseDragDelta(0) to query for the dragged amount on any widget."
                   );
        uVar9 = 0;
        do {
          bVar6 = IsMouseDragging(uVar9,-1.0);
          bVar7 = IsMouseDragging(uVar9,0.0);
          bVar8 = IsMouseDragging(uVar9,20.0);
          Text("IsMouseDragging(%d):\n  w/ default threshold: %d,\n  w/ zero threshold: %d\n  w/ large threshold: %d"
               ,(ulong)uVar9,(ulong)bVar6,(ulong)bVar7,(ulong)bVar8);
          uVar9 = uVar9 + 1;
        } while (uVar9 != 3);
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        Button("Drag Me",(ImVec2 *)local_e8);
        bVar6 = IsItemActive();
        if (bVar6) {
          pIVar16 = GetForegroundDrawList();
          IVar10 = GetColorU32(0x15,1.0);
          ImDrawList::AddLine(pIVar16,pIVar15->MouseClickedPos,&pIVar15->MousePos,IVar10,4.0);
        }
        IVar4 = GetMouseDragDelta(0,0.0);
        fStack_110 = (float)extraout_XMM0_Dc_02;
        local_118._0_4_ = IVar4.x;
        local_118._4_4_ = IVar4.y;
        fStack_10c = (float)extraout_XMM0_Dd_02;
        IVar4 = GetMouseDragDelta(0,-1.0);
        Text("GetMouseDragDelta(0):\n  w/ default threshold: (%.1f, %.1f),\n  w/ zero threshold: (%.1f, %.1f)\nMouseDelta: (%.1f, %.1f)"
             ,SUB84((double)IVar4.x,0),SUB84((double)IVar4.y,0),
             SUB84((double)(float)local_118._0_4_,0),SUB84((double)(float)local_118._4_4_,0),
             (double)(pIVar15->MouseDelta).x,(double)(pIVar15->MouseDelta).y);
        TreePop();
      }
      bVar6 = TreeNode("Mouse cursors");
      if (bVar6) {
        uVar9 = GetMouseCursor();
        IVar12 = GetMouseCursor();
        puVar25 = &DAT_001eaa70;
        Text("Current mouse cursor = %d: %s",(ulong)uVar9,(&DAT_001eaa70)[IVar12]);
        Text("Hover to see mouse cursors:");
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Your application can render a different mouse cursor based on what ImGui::GetMouseCursor() returns. If software cursor rendering (io.MouseDrawCursor) is set ImGui will draw the right cursor for you, otherwise your backend needs to handle it."
                  );
        uVar18 = 0;
        do {
          sprintf(local_e8,"Mouse cursor %d: %s",uVar18 & 0xffffffff,*puVar25);
          Bullet();
          local_128.x = 0.0;
          local_128.y = 0.0;
          Selectable(local_e8,false,0,&local_128);
          bVar6 = IsItemHovered(0);
          if ((bVar6) || (bVar6 = IsItemFocused(), bVar6)) {
            SetMouseCursor((ImGuiMouseCursor)uVar18);
          }
          uVar18 = uVar18 + 1;
          puVar25 = puVar25 + 1;
        } while (uVar18 != 8);
        TreePop();
      }
    }
  }
  End();
  return;
}

Assistant:

void ImGui::ShowDemoWindow(bool* p_open)
{
    IM_ASSERT(ImGui::GetCurrentContext() != NULL && "Missing dear imgui context. Refer to examples app!"); // Exceptionally add an extra assert here for people confused with initial dear imgui setup

    // Examples Apps (accessible from the "Examples" menu)
    static bool show_app_documents = false;
    static bool show_app_main_menu_bar = false;
    static bool show_app_console = false;
    static bool show_app_log = false;
    static bool show_app_layout = false;
    static bool show_app_property_editor = false;
    static bool show_app_long_text = false;
    static bool show_app_auto_resize = false;
    static bool show_app_constrained_resize = false;
    static bool show_app_simple_overlay = false;
    static bool show_app_window_titles = false;
    static bool show_app_custom_rendering = false;

    if (show_app_documents)           ShowExampleAppDocuments(&show_app_documents);
    if (show_app_main_menu_bar)       ShowExampleAppMainMenuBar();
    if (show_app_console)             ShowExampleAppConsole(&show_app_console);
    if (show_app_log)                 ShowExampleAppLog(&show_app_log);
    if (show_app_layout)              ShowExampleAppLayout(&show_app_layout);
    if (show_app_property_editor)     ShowExampleAppPropertyEditor(&show_app_property_editor);
    if (show_app_long_text)           ShowExampleAppLongText(&show_app_long_text);
    if (show_app_auto_resize)         ShowExampleAppAutoResize(&show_app_auto_resize);
    if (show_app_constrained_resize)  ShowExampleAppConstrainedResize(&show_app_constrained_resize);
    if (show_app_simple_overlay)      ShowExampleAppSimpleOverlay(&show_app_simple_overlay);
    if (show_app_window_titles)       ShowExampleAppWindowTitles(&show_app_window_titles);
    if (show_app_custom_rendering)    ShowExampleAppCustomRendering(&show_app_custom_rendering);

    // Dear ImGui Apps (accessible from the "Tools" menu)
    static bool show_app_metrics = false;
    static bool show_app_style_editor = false;
    static bool show_app_about = false;

    if (show_app_metrics)             { ImGui::ShowMetricsWindow(&show_app_metrics); }
    if (show_app_style_editor)        { ImGui::Begin("Style Editor", &show_app_style_editor); ImGui::ShowStyleEditor(); ImGui::End(); }
    if (show_app_about)               { ImGui::ShowAboutWindow(&show_app_about); }

    // Demonstrate the various window flags. Typically you would just use the default!
    static bool no_titlebar = false;
    static bool no_scrollbar = false;
    static bool no_menu = false;
    static bool no_move = false;
    static bool no_resize = false;
    static bool no_collapse = false;
    static bool no_close = false;
    static bool no_nav = false;
    static bool no_background = false;
    static bool no_bring_to_front = false;

    ImGuiWindowFlags window_flags = 0;
    if (no_titlebar)        window_flags |= ImGuiWindowFlags_NoTitleBar;
    if (no_scrollbar)       window_flags |= ImGuiWindowFlags_NoScrollbar;
    if (!no_menu)           window_flags |= ImGuiWindowFlags_MenuBar;
    if (no_move)            window_flags |= ImGuiWindowFlags_NoMove;
    if (no_resize)          window_flags |= ImGuiWindowFlags_NoResize;
    if (no_collapse)        window_flags |= ImGuiWindowFlags_NoCollapse;
    if (no_nav)             window_flags |= ImGuiWindowFlags_NoNav;
    if (no_background)      window_flags |= ImGuiWindowFlags_NoBackground;
    if (no_bring_to_front)  window_flags |= ImGuiWindowFlags_NoBringToFrontOnFocus;
    if (no_close)           p_open = NULL; // Don't pass our bool* to Begin

    // We specify a default position/size in case there's no data in the .ini file. Typically this isn't required! We only do it to make the Demo applications a little more welcoming.
    ImGui::SetNextWindowPos(ImVec2(650, 20), ImGuiCond_FirstUseEver);
    ImGui::SetNextWindowSize(ImVec2(550, 680), ImGuiCond_FirstUseEver);

    // Main body of the Demo window starts here.
    if (!ImGui::Begin("Dear ImGui Demo", p_open, window_flags))
    {
        // Early out if the window is collapsed, as an optimization.
        ImGui::End();
        return;
    }

    // Most "big" widgets share a common width settings by default.
    //ImGui::PushItemWidth(ImGui::GetWindowWidth() * 0.65f);    // Use 2/3 of the space for widgets and 1/3 for labels (default)
    ImGui::PushItemWidth(ImGui::GetFontSize() * -12);           // Use fixed width for labels (by passing a negative value), the rest goes to widgets. We choose a width proportional to our font size.

    // Menu Bar
    if (ImGui::BeginMenuBar())
    {
        if (ImGui::BeginMenu("Menu"))
        {
            ShowExampleMenuFile();
            ImGui::EndMenu();
        }
        if (ImGui::BeginMenu("Examples"))
        {
            ImGui::MenuItem("Main menu bar", NULL, &show_app_main_menu_bar);
            ImGui::MenuItem("Console", NULL, &show_app_console);
            ImGui::MenuItem("Log", NULL, &show_app_log);
            ImGui::MenuItem("Simple layout", NULL, &show_app_layout);
            ImGui::MenuItem("Property editor", NULL, &show_app_property_editor);
            ImGui::MenuItem("Long text display", NULL, &show_app_long_text);
            ImGui::MenuItem("Auto-resizing window", NULL, &show_app_auto_resize);
            ImGui::MenuItem("Constrained-resizing window", NULL, &show_app_constrained_resize);
            ImGui::MenuItem("Simple overlay", NULL, &show_app_simple_overlay);
            ImGui::MenuItem("Manipulating window titles", NULL, &show_app_window_titles);
            ImGui::MenuItem("Custom rendering", NULL, &show_app_custom_rendering);
            ImGui::MenuItem("Documents", NULL, &show_app_documents);
            ImGui::EndMenu();
        }
        if (ImGui::BeginMenu("Tools"))
        {
            ImGui::MenuItem("Metrics", NULL, &show_app_metrics);
            ImGui::MenuItem("Style Editor", NULL, &show_app_style_editor);
            ImGui::MenuItem("About Dear ImGui", NULL, &show_app_about);
            ImGui::EndMenu();
        }
        ImGui::EndMenuBar();
    }

    ImGui::Text("dear imgui says hello. (%s)", IMGUI_VERSION);
    ImGui::Spacing();

    if (ImGui::CollapsingHeader("Help"))
    {
        ImGui::Text("PROGRAMMER GUIDE:");
        ImGui::BulletText("Please see the ShowDemoWindow() code in imgui_demo.cpp. <- you are here!");
        ImGui::BulletText("Please see the comments in imgui.cpp.");
        ImGui::BulletText("Please see the examples/ application.");
        ImGui::BulletText("Enable 'io.ConfigFlags |= NavEnableKeyboard' for keyboard controls.");
        ImGui::BulletText("Enable 'io.ConfigFlags |= NavEnableGamepad' for gamepad controls.");
        ImGui::Separator();

        ImGui::Text("USER GUIDE:");
        ImGui::ShowUserGuide();
    }

    if (ImGui::CollapsingHeader("Configuration"))
    {
        ImGuiIO& io = ImGui::GetIO();

        if (ImGui::TreeNode("Configuration##2"))
        {
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableKeyboard", (unsigned int *)&io.ConfigFlags, ImGuiConfigFlags_NavEnableKeyboard);
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableGamepad", (unsigned int *)&io.ConfigFlags, ImGuiConfigFlags_NavEnableGamepad);
            ImGui::SameLine(); HelpMarker("Required back-end to feed in gamepad inputs in io.NavInputs[] and set io.BackendFlags |= ImGuiBackendFlags_HasGamepad.\n\nRead instructions in imgui.cpp for details.");
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableSetMousePos", (unsigned int *)&io.ConfigFlags, ImGuiConfigFlags_NavEnableSetMousePos);
            ImGui::SameLine(); HelpMarker("Instruct navigation to move the mouse cursor. See comment for ImGuiConfigFlags_NavEnableSetMousePos.");
            ImGui::CheckboxFlags("io.ConfigFlags: NoMouse", (unsigned int *)&io.ConfigFlags, ImGuiConfigFlags_NoMouse);
            if (io.ConfigFlags & ImGuiConfigFlags_NoMouse) // Create a way to restore this flag otherwise we could be stuck completely!
            {
                if (fmodf((float)ImGui::GetTime(), 0.40f) < 0.20f)
                {
                    ImGui::SameLine();
                    ImGui::Text("<<PRESS SPACE TO DISABLE>>");
                }
                if (ImGui::IsKeyPressed(ImGui::GetKeyIndex(ImGuiKey_Space)))
                    io.ConfigFlags &= ~ImGuiConfigFlags_NoMouse;
            }
            ImGui::CheckboxFlags("io.ConfigFlags: NoMouseCursorChange", (unsigned int *)&io.ConfigFlags, ImGuiConfigFlags_NoMouseCursorChange);
            ImGui::SameLine(); HelpMarker("Instruct back-end to not alter mouse cursor shape and visibility.");
            ImGui::Checkbox("io.ConfigInputTextCursorBlink", &io.ConfigInputTextCursorBlink);
            ImGui::SameLine(); HelpMarker("Set to false to disable blinking cursor, for users who consider it distracting");
            ImGui::Checkbox("io.ConfigWindowsResizeFromEdges", &io.ConfigWindowsResizeFromEdges);
            ImGui::SameLine(); HelpMarker("Enable resizing of windows from their edges and from the lower-left corner.\nThis requires (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors) because it needs mouse cursor feedback.");
            ImGui::Checkbox("io.ConfigWindowsMoveFromTitleBarOnly", &io.ConfigWindowsMoveFromTitleBarOnly);
            ImGui::Checkbox("io.MouseDrawCursor", &io.MouseDrawCursor);
            ImGui::SameLine(); HelpMarker("Instruct Dear ImGui to render a mouse cursor for you. Note that a mouse cursor rendered via your application GPU rendering path will feel more laggy than hardware cursor, but will be more in sync with your other visuals.\n\nSome desktop applications may use both kinds of cursors (e.g. enable software cursor only when resizing/dragging something).");
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Backend Flags"))
        {
            HelpMarker("Those flags are set by the back-ends (imgui_impl_xxx files) to specify their capabilities.");
            ImGuiBackendFlags backend_flags = io.BackendFlags; // Make a local copy to avoid modifying actual back-end flags.
            ImGui::CheckboxFlags("io.BackendFlags: HasGamepad", (unsigned int *)&backend_flags, ImGuiBackendFlags_HasGamepad);
            ImGui::CheckboxFlags("io.BackendFlags: HasMouseCursors", (unsigned int *)&backend_flags, ImGuiBackendFlags_HasMouseCursors);
            ImGui::CheckboxFlags("io.BackendFlags: HasSetMousePos", (unsigned int *)&backend_flags, ImGuiBackendFlags_HasSetMousePos);
            ImGui::CheckboxFlags("io.BackendFlags: RendererHasVtxOffset", (unsigned int *)&backend_flags, ImGuiBackendFlags_RendererHasVtxOffset);
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Style"))
        {
            ImGui::ShowStyleEditor();
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Capture/Logging"))
        {
            ImGui::TextWrapped("The logging API redirects all text output so you can easily capture the content of a window or a block. Tree nodes can be automatically expanded.");
            HelpMarker("Try opening any of the contents below in this window and then click one of the \"Log To\" button.");
            ImGui::LogButtons();
            ImGui::TextWrapped("You can also call ImGui::LogText() to output directly to the log without a visual output.");
            if (ImGui::Button("Copy \"Hello, world!\" to clipboard"))
            {
                ImGui::LogToClipboard();
                ImGui::LogText("Hello, world!");
                ImGui::LogFinish();
            }
            ImGui::TreePop();
        }
    }

    if (ImGui::CollapsingHeader("Window options"))
    {
        ImGui::Checkbox("No titlebar", &no_titlebar); ImGui::SameLine(150);
        ImGui::Checkbox("No scrollbar", &no_scrollbar); ImGui::SameLine(300);
        ImGui::Checkbox("No menu", &no_menu);
        ImGui::Checkbox("No move", &no_move); ImGui::SameLine(150);
        ImGui::Checkbox("No resize", &no_resize); ImGui::SameLine(300);
        ImGui::Checkbox("No collapse", &no_collapse);
        ImGui::Checkbox("No close", &no_close); ImGui::SameLine(150);
        ImGui::Checkbox("No nav", &no_nav); ImGui::SameLine(300);
        ImGui::Checkbox("No background", &no_background);
        ImGui::Checkbox("No bring to front", &no_bring_to_front);
    }

    // All demo contents
    ShowDemoWindowWidgets();
    ShowDemoWindowLayout();
    ShowDemoWindowPopups();
    ShowDemoWindowColumns();
    ShowDemoWindowMisc();

    // End of ShowDemoWindow()
    ImGui::End();
}